

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  byte bVar49;
  ulong uVar50;
  byte bVar51;
  byte bVar52;
  ulong uVar53;
  byte bVar54;
  byte bVar55;
  uint uVar56;
  byte bVar57;
  byte bVar58;
  long lVar59;
  bool bVar60;
  bool bVar61;
  ulong uVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar134;
  uint uVar135;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar76 [16];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  float fVar141;
  float fVar142;
  float fVar163;
  vint4 bi_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  vint4 ai_2;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  vint4 bi;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  vint4 ai;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar229;
  float fVar235;
  float fVar236;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [32];
  float fVar241;
  vint4 ai_1;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar248;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  float t;
  float fVar252;
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar254 [64];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  float s;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_9f0;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  RTCHitN local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 local_140;
  float local_138 [66];
  undefined1 auVar129 [32];
  undefined1 auVar132 [32];
  undefined1 auVar121 [32];
  
  PVar2 = prim[1];
  uVar50 = (ulong)(byte)PVar2;
  fVar141 = *(float *)(prim + uVar50 * 0x19 + 0x12);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar70 = vsubps_avx(auVar70,*(undefined1 (*) [16])(prim + uVar50 * 0x19 + 6));
  auVar202._0_4_ = fVar141 * auVar70._0_4_;
  auVar202._4_4_ = fVar141 * auVar70._4_4_;
  auVar202._8_4_ = fVar141 * auVar70._8_4_;
  auVar202._12_4_ = fVar141 * auVar70._12_4_;
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 4 + 6)));
  auVar76._0_4_ = fVar141 * auVar68._0_4_;
  auVar76._4_4_ = fVar141 * auVar68._4_4_;
  auVar76._8_4_ = fVar141 * auVar68._8_4_;
  auVar76._12_4_ = fVar141 * auVar68._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 5 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 6 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xb + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar50 + 6)));
  uVar62 = (ulong)(uint)((int)(uVar50 * 9) * 2);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar244 = vcvtdq2ps_avx(auVar244);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 + uVar50 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar63 = (ulong)(uint)((int)(uVar50 * 5) << 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar263._4_4_ = auVar76._0_4_;
  auVar263._0_4_ = auVar76._0_4_;
  auVar263._8_4_ = auVar76._0_4_;
  auVar263._12_4_ = auVar76._0_4_;
  auVar72 = vshufps_avx(auVar76,auVar76,0x55);
  auVar73 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar141 = auVar73._0_4_;
  auVar218._0_4_ = fVar141 * auVar65._0_4_;
  fVar163 = auVar73._4_4_;
  auVar218._4_4_ = fVar163 * auVar65._4_4_;
  fVar229 = auVar73._8_4_;
  auVar218._8_4_ = fVar229 * auVar65._8_4_;
  fVar235 = auVar73._12_4_;
  auVar218._12_4_ = fVar235 * auVar65._12_4_;
  auVar164._0_4_ = auVar66._0_4_ * fVar141;
  auVar164._4_4_ = auVar66._4_4_ * fVar163;
  auVar164._8_4_ = auVar66._8_4_ * fVar229;
  auVar164._12_4_ = auVar66._12_4_ * fVar235;
  auVar143._0_4_ = auVar67._0_4_ * fVar141;
  auVar143._4_4_ = auVar67._4_4_ * fVar163;
  auVar143._8_4_ = auVar67._8_4_ * fVar229;
  auVar143._12_4_ = auVar67._12_4_ * fVar235;
  auVar73 = vfmadd231ps_fma(auVar218,auVar72,auVar68);
  auVar74 = vfmadd231ps_fma(auVar164,auVar72,auVar77);
  auVar72 = vfmadd231ps_fma(auVar143,auVar71,auVar72);
  auVar75 = vfmadd231ps_fma(auVar73,auVar263,auVar70);
  auVar74 = vfmadd231ps_fma(auVar74,auVar263,auVar69);
  auVar76 = vfmadd231ps_fma(auVar72,auVar244,auVar263);
  auVar264._4_4_ = auVar202._0_4_;
  auVar264._0_4_ = auVar202._0_4_;
  auVar264._8_4_ = auVar202._0_4_;
  auVar264._12_4_ = auVar202._0_4_;
  auVar72 = vshufps_avx(auVar202,auVar202,0x55);
  auVar73 = vshufps_avx(auVar202,auVar202,0xaa);
  auVar65 = vmulps_avx512vl(auVar73,auVar65);
  auVar203._0_4_ = auVar73._0_4_ * auVar66._0_4_;
  auVar203._4_4_ = auVar73._4_4_ * auVar66._4_4_;
  auVar203._8_4_ = auVar73._8_4_ * auVar66._8_4_;
  auVar203._12_4_ = auVar73._12_4_ * auVar66._12_4_;
  auVar184._0_4_ = auVar73._0_4_ * auVar67._0_4_;
  auVar184._4_4_ = auVar73._4_4_ * auVar67._4_4_;
  auVar184._8_4_ = auVar73._8_4_ * auVar67._8_4_;
  auVar184._12_4_ = auVar73._12_4_ * auVar67._12_4_;
  auVar66 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar68);
  auVar68 = vfmadd231ps_fma(auVar203,auVar72,auVar77);
  auVar65 = vfmadd231ps_fma(auVar184,auVar72,auVar71);
  auVar67 = vfmadd231ps_avx512vl(auVar66,auVar264,auVar70);
  auVar66 = vfmadd231ps_fma(auVar68,auVar264,auVar69);
  auVar71 = vfmadd231ps_fma(auVar65,auVar264,auVar244);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar70 = vandps_avx(auVar75,auVar242);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar70,auVar230,1);
  bVar61 = (bool)((byte)uVar62 & 1);
  auVar73._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._0_4_;
  bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._4_4_;
  bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._8_4_;
  bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._12_4_;
  auVar70 = vandps_avx(auVar74,auVar242);
  uVar62 = vcmpps_avx512vl(auVar70,auVar230,1);
  bVar61 = (bool)((byte)uVar62 & 1);
  auVar75._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar74._0_4_;
  bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar74._4_4_;
  bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar74._8_4_;
  bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar74._12_4_;
  auVar70 = vandps_avx(auVar76,auVar242);
  uVar62 = vcmpps_avx512vl(auVar70,auVar230,1);
  bVar61 = (bool)((byte)uVar62 & 1);
  auVar74._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._0_4_;
  bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._4_4_;
  bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._8_4_;
  bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._12_4_;
  auVar68 = vrcp14ps_avx512vl(auVar73);
  auVar231._8_4_ = 0x3f800000;
  auVar231._0_8_ = &DAT_3f8000003f800000;
  auVar231._12_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar73,auVar68,auVar231);
  auVar65 = vfmadd132ps_fma(auVar70,auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar75);
  auVar70 = vfnmadd213ps_fma(auVar75,auVar68,auVar231);
  auVar77 = vfmadd132ps_fma(auVar70,auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar74);
  auVar70 = vfnmadd213ps_fma(auVar74,auVar68,auVar231);
  auVar244 = vfmadd132ps_fma(auVar70,auVar68,auVar68);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar50 * 7 + 6);
  auVar70 = vpmovsxwd_avx(auVar70);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vsubps_avx512vl(auVar70,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar50 * 9 + 6);
  auVar70 = vpmovsxwd_avx(auVar68);
  auVar227._0_4_ = auVar65._0_4_ * auVar69._0_4_;
  auVar227._4_4_ = auVar65._4_4_ * auVar69._4_4_;
  auVar227._8_4_ = auVar65._8_4_ * auVar69._8_4_;
  auVar227._12_4_ = auVar65._12_4_ * auVar69._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx512vl(auVar70,auVar67);
  auVar219._0_4_ = auVar65._0_4_ * auVar70._0_4_;
  auVar219._4_4_ = auVar65._4_4_ * auVar70._4_4_;
  auVar219._8_4_ = auVar65._8_4_ * auVar70._8_4_;
  auVar219._12_4_ = auVar65._12_4_ * auVar70._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar68 = vpmovsxwd_avx(auVar65);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar50 * -2 + 6);
  auVar70 = vpmovsxwd_avx(auVar69);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar66);
  auVar243._0_4_ = auVar77._0_4_ * auVar70._0_4_;
  auVar243._4_4_ = auVar77._4_4_ * auVar70._4_4_;
  auVar243._8_4_ = auVar77._8_4_ * auVar70._8_4_;
  auVar243._12_4_ = auVar77._12_4_ * auVar70._12_4_;
  auVar70 = vcvtdq2ps_avx(auVar68);
  auVar70 = vsubps_avx(auVar70,auVar66);
  auVar165._0_4_ = auVar77._0_4_ * auVar70._0_4_;
  auVar165._4_4_ = auVar77._4_4_ * auVar70._4_4_;
  auVar165._8_4_ = auVar77._8_4_ * auVar70._8_4_;
  auVar165._12_4_ = auVar77._12_4_ * auVar70._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar63 + uVar50 + 6);
  auVar70 = vpmovsxwd_avx(auVar77);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar204._0_4_ = auVar244._0_4_ * auVar70._0_4_;
  auVar204._4_4_ = auVar244._4_4_ * auVar70._4_4_;
  auVar204._8_4_ = auVar244._8_4_ * auVar70._8_4_;
  auVar204._12_4_ = auVar244._12_4_ * auVar70._12_4_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar50 * 0x17 + 6);
  auVar70 = vpmovsxwd_avx(auVar66);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar71);
  auVar144._0_4_ = auVar244._0_4_ * auVar70._0_4_;
  auVar144._4_4_ = auVar244._4_4_ * auVar70._4_4_;
  auVar144._8_4_ = auVar244._8_4_ * auVar70._8_4_;
  auVar144._12_4_ = auVar244._12_4_ * auVar70._12_4_;
  auVar70 = vpminsd_avx(auVar227,auVar219);
  auVar68 = vpminsd_avx(auVar243,auVar165);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68 = vpminsd_avx(auVar204,auVar144);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar244._4_4_ = uVar1;
  auVar244._0_4_ = uVar1;
  auVar244._8_4_ = uVar1;
  auVar244._12_4_ = uVar1;
  auVar68 = vmaxps_avx512vl(auVar68,auVar244);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar70,auVar71);
  auVar70 = vpmaxsd_avx(auVar227,auVar219);
  auVar68 = vpmaxsd_avx(auVar243,auVar165);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar68 = vpmaxsd_avx(auVar204,auVar144);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  auVar68 = vminps_avx512vl(auVar68,auVar67);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar70 = vmulps_avx512vl(auVar70,auVar72);
  auVar68 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_510,auVar70,2);
  uVar62 = vpcmpgtd_avx512vl(auVar68,_DAT_01ff0cf0);
  uVar62 = ((byte)uVar12 & 0xf) & uVar62;
  bVar60 = (char)uVar62 == '\0';
  bVar61 = !bVar60;
  if (bVar60) {
    return bVar61;
  }
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01b55407:
  lVar59 = 0;
  for (uVar50 = uVar62; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar56 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar56].ptr;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar59 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar59 = *(long *)&pGVar3[1].time_range.upper;
  auVar70 = *(undefined1 (*) [16])(lVar59 + (long)p_Var4 * uVar50);
  auVar68 = *(undefined1 (*) [16])(lVar59 + (uVar50 + 1) * (long)p_Var4);
  uVar62 = uVar62 - 1 & uVar62;
  if (uVar62 != 0) {
    uVar53 = uVar62 - 1 & uVar62;
    for (uVar63 = uVar62; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    }
    if (uVar53 != 0) {
      for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar69 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar78 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar265._4_4_ = uVar1;
  auVar265._0_4_ = uVar1;
  auVar265._8_4_ = uVar1;
  auVar265._12_4_ = uVar1;
  local_5e0._16_4_ = uVar1;
  local_5e0._0_16_ = auVar265;
  local_5e0._20_4_ = uVar1;
  local_5e0._24_4_ = uVar1;
  local_5e0._28_4_ = uVar1;
  auVar65 = vunpcklps_avx512vl(auVar78._0_16_,auVar265);
  fVar141 = *(float *)(ray + k * 4 + 0xc0);
  auVar262._4_4_ = fVar141;
  auVar262._0_4_ = fVar141;
  auVar262._8_4_ = fVar141;
  auVar262._12_4_ = fVar141;
  local_460._16_4_ = fVar141;
  local_460._0_16_ = auVar262;
  local_460._20_4_ = fVar141;
  local_460._24_4_ = fVar141;
  local_460._28_4_ = fVar141;
  local_770 = vinsertps_avx(auVar65,auVar262,0x28);
  auVar254 = ZEXT1664(local_770);
  auVar228._0_4_ = auVar70._0_4_ + auVar68._0_4_;
  auVar228._4_4_ = auVar70._4_4_ + auVar68._4_4_;
  auVar228._8_4_ = auVar70._8_4_ + auVar68._8_4_;
  auVar228._12_4_ = auVar70._12_4_ + auVar68._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar65 = vmulps_avx512vl(auVar228,auVar16);
  auVar65 = vsubps_avx(auVar65,auVar69);
  auVar65 = vdpps_avx(auVar65,local_770,0x7f);
  fVar163 = *(float *)(ray + k * 4 + 0x60);
  local_780 = vdpps_avx(local_770,local_770,0x7f);
  auVar261 = ZEXT1664(local_780);
  auVar232._4_12_ = ZEXT812(0) << 0x20;
  auVar232._0_4_ = local_780._0_4_;
  auVar66 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar232);
  auVar77 = vfnmadd213ss_fma(auVar66,local_780,ZEXT416(0x40000000));
  local_260 = auVar65._0_4_ * auVar66._0_4_ * auVar77._0_4_;
  auVar233._4_4_ = local_260;
  auVar233._0_4_ = local_260;
  auVar233._8_4_ = local_260;
  auVar233._12_4_ = local_260;
  fStack_5b0 = local_260;
  _local_5c0 = auVar233;
  fStack_5ac = local_260;
  fStack_5a8 = local_260;
  fStack_5a4 = local_260;
  auVar65 = vfmadd231ps_fma(auVar69,local_770,auVar233);
  auVar65 = vblendps_avx(auVar65,ZEXT816(0) << 0x40,8);
  auVar70 = vsubps_avx(auVar70,auVar65);
  auVar69 = vsubps_avx(*(undefined1 (*) [16])(lVar59 + (uVar50 + 2) * (long)p_Var4),auVar65);
  auVar68 = vsubps_avx(auVar68,auVar65);
  auVar251 = ZEXT1664(auVar68);
  auVar65 = vsubps_avx(*(undefined1 (*) [16])(lVar59 + (uVar50 + 3) * (long)p_Var4),auVar65);
  auVar79 = vbroadcastss_avx512vl(auVar70);
  auVar89._8_4_ = 1;
  auVar89._0_8_ = 0x100000001;
  auVar89._12_4_ = 1;
  auVar89._16_4_ = 1;
  auVar89._20_4_ = 1;
  auVar89._24_4_ = 1;
  auVar89._28_4_ = 1;
  local_700 = ZEXT1632(auVar70);
  auVar80 = vpermps_avx512vl(auVar89,local_700);
  auVar88._8_4_ = 2;
  auVar88._0_8_ = 0x200000002;
  auVar88._12_4_ = 2;
  auVar88._16_4_ = 2;
  auVar88._20_4_ = 2;
  auVar88._24_4_ = 2;
  auVar88._28_4_ = 2;
  auVar81 = vpermps_avx512vl(auVar88,local_700);
  auVar90._8_4_ = 3;
  auVar90._0_8_ = 0x300000003;
  auVar90._12_4_ = 3;
  auVar90._16_4_ = 3;
  auVar90._20_4_ = 3;
  auVar90._24_4_ = 3;
  auVar90._28_4_ = 3;
  auVar82 = vpermps_avx512vl(auVar90,local_700);
  local_280 = vbroadcastss_avx512vl(auVar68);
  local_740 = ZEXT1632(auVar68);
  auVar83 = vpermps_avx512vl(auVar89,local_740);
  auVar84 = vpermps_avx512vl(auVar88,local_740);
  auVar85 = vpermps_avx512vl(auVar90,local_740);
  auVar86 = vbroadcastss_avx512vl(auVar69);
  local_720 = ZEXT1632(auVar69);
  local_7a0 = vpermps_avx512vl(auVar89,local_720);
  auVar269 = ZEXT3264(local_7a0);
  auVar87 = vpermps_avx512vl(auVar88,local_720);
  local_1e0 = vpermps_avx2(auVar90,local_720);
  local_2a0 = auVar65._0_4_;
  _local_760 = ZEXT1632(auVar65);
  local_2c0 = vpermps_avx512vl(auVar89,_local_760);
  _local_200 = vpermps_avx2(auVar88,_local_760);
  local_220 = vpermps_avx2(auVar90,_local_760);
  auVar70 = vfmadd231ps_fma(ZEXT432((uint)(fVar141 * fVar141)),local_5e0,local_5e0);
  local_480 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar78,auVar78);
  local_240._0_4_ = local_480._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar91);
  local_6a0 = ZEXT416((uint)local_260);
  local_260 = fVar163 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_4c0 = vpbroadcastd_avx512vl();
  fVar141 = 1.4013e-45;
  uVar50 = 0;
  bVar57 = 0;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar70 = vsqrtss_avx(local_780,local_780);
  auVar68 = vsqrtss_avx(local_780,local_780);
  local_6c0 = ZEXT816(0x3f80000000000000);
  auVar217 = ZEXT3264(_DAT_02020f20);
  auVar201 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  do {
    auVar65 = vmovshdup_avx(local_6c0);
    auVar222._0_4_ = local_6c0._0_4_;
    fVar229 = auVar65._0_4_ - auVar222._0_4_;
    fVar240 = fVar229 * 0.04761905;
    auVar222._4_4_ = auVar222._0_4_;
    auVar222._8_4_ = auVar222._0_4_;
    auVar222._12_4_ = auVar222._0_4_;
    auVar222._16_4_ = auVar222._0_4_;
    auVar222._20_4_ = auVar222._0_4_;
    auVar222._24_4_ = auVar222._0_4_;
    auVar222._28_4_ = auVar222._0_4_;
    auVar153._4_4_ = fVar229;
    auVar153._0_4_ = fVar229;
    auVar153._8_4_ = fVar229;
    auVar153._12_4_ = fVar229;
    auVar153._16_4_ = fVar229;
    auVar153._20_4_ = fVar229;
    auVar153._24_4_ = fVar229;
    auVar153._28_4_ = fVar229;
    auVar65 = vfmadd231ps_fma(auVar222,auVar153,auVar217._0_32_);
    auVar91 = vsubps_avx(auVar201._0_32_,ZEXT1632(auVar65));
    fVar229 = auVar65._0_4_;
    fVar235 = auVar65._4_4_;
    fVar236 = auVar65._8_4_;
    fVar237 = auVar65._12_4_;
    fVar238 = auVar91._0_4_;
    fVar239 = auVar91._4_4_;
    fVar258 = auVar91._8_4_;
    fVar241 = auVar91._12_4_;
    fVar142 = auVar91._16_4_;
    fVar247 = auVar91._20_4_;
    fVar248 = auVar91._24_4_;
    auVar97._4_4_ = fVar239 * fVar239 * -fVar235;
    auVar97._0_4_ = fVar238 * fVar238 * -fVar229;
    auVar97._8_4_ = fVar258 * fVar258 * -fVar236;
    auVar97._12_4_ = fVar241 * fVar241 * -fVar237;
    auVar97._16_4_ = fVar142 * fVar142 * -0.0;
    auVar97._20_4_ = fVar247 * fVar247 * -0.0;
    auVar97._24_4_ = fVar248 * fVar248 * -0.0;
    auVar97._28_4_ = 0x80000000;
    auVar88 = vmulps_avx512vl(ZEXT1632(auVar65),ZEXT1632(auVar65));
    fVar252 = fVar229 * 3.0;
    fVar255 = fVar235 * 3.0;
    fVar256 = fVar236 * 3.0;
    fVar257 = fVar237 * 3.0;
    auVar201._28_36_ = auVar254._28_36_;
    auVar201._0_28_ = ZEXT1628(CONCAT412(fVar257,CONCAT48(fVar256,CONCAT44(fVar255,fVar252))));
    auVar259._0_4_ = fVar252 + -5.0;
    auVar259._4_4_ = fVar255 + -5.0;
    auVar259._8_4_ = fVar256 + -5.0;
    auVar259._12_4_ = fVar257 + -5.0;
    auVar259._16_4_ = 0xc0a00000;
    auVar259._20_4_ = 0xc0a00000;
    auVar259._24_4_ = 0xc0a00000;
    auVar259._28_4_ = auVar254._28_4_ + -5.0;
    auVar89 = vmulps_avx512vl(auVar88,auVar259);
    auVar114._0_4_ = auVar89._0_4_ + 2.0;
    auVar114._4_4_ = auVar89._4_4_ + 2.0;
    auVar114._8_4_ = auVar89._8_4_ + 2.0;
    auVar114._12_4_ = auVar89._12_4_ + 2.0;
    auVar114._16_4_ = auVar89._16_4_ + 2.0;
    auVar114._20_4_ = auVar89._20_4_ + 2.0;
    auVar114._24_4_ = auVar89._24_4_ + 2.0;
    auVar114._28_4_ = auVar89._28_4_ + 2.0;
    auVar217._0_4_ = fVar238 * fVar238;
    auVar217._4_4_ = fVar239 * fVar239;
    auVar217._8_4_ = fVar258 * fVar258;
    auVar217._12_4_ = fVar241 * fVar241;
    auVar217._16_4_ = fVar142 * fVar142;
    auVar217._20_4_ = fVar247 * fVar247;
    auVar217._28_36_ = auVar261._28_36_;
    auVar217._24_4_ = fVar248 * fVar248;
    auVar121._0_4_ = auVar217._0_4_ * (fVar238 * 3.0 + -5.0) + 2.0;
    auVar121._4_4_ = auVar217._4_4_ * (fVar239 * 3.0 + -5.0) + 2.0;
    auVar121._8_4_ = auVar217._8_4_ * (fVar258 * 3.0 + -5.0) + 2.0;
    auVar121._12_4_ = auVar217._12_4_ * (fVar241 * 3.0 + -5.0) + 2.0;
    auVar121._16_4_ = auVar217._16_4_ * (fVar142 * 3.0 + -5.0) + 2.0;
    auVar121._20_4_ = auVar217._20_4_ * (fVar247 * 3.0 + -5.0) + 2.0;
    auVar121._24_4_ = auVar217._24_4_ * (fVar248 * 3.0 + -5.0) + 2.0;
    auVar121._28_4_ = auVar251._28_4_ + -5.0 + 2.0;
    fVar253 = auVar91._28_4_;
    auVar98._4_4_ = fVar235 * fVar235 * -fVar239;
    auVar98._0_4_ = fVar229 * fVar229 * -fVar238;
    auVar98._8_4_ = fVar236 * fVar236 * -fVar258;
    auVar98._12_4_ = fVar237 * fVar237 * -fVar241;
    auVar98._16_4_ = -fVar142 * 0.0 * 0.0;
    auVar98._20_4_ = -fVar247 * 0.0 * 0.0;
    auVar98._24_4_ = -fVar248 * 0.0 * 0.0;
    auVar98._28_4_ = -fVar253;
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar91 = vmulps_avx512vl(auVar97,auVar90);
    auVar89 = vmulps_avx512vl(auVar114,auVar90);
    auVar92 = vmulps_avx512vl(auVar121,auVar90);
    auVar93 = vmulps_avx512vl(auVar98,auVar90);
    auVar100._4_4_ = fStack_29c * auVar93._4_4_;
    auVar100._0_4_ = local_2a0 * auVar93._0_4_;
    auVar100._8_4_ = fStack_298 * auVar93._8_4_;
    auVar100._12_4_ = fStack_294 * auVar93._12_4_;
    auVar100._16_4_ = fStack_290 * auVar93._16_4_;
    auVar100._20_4_ = fStack_28c * auVar93._20_4_;
    auVar100._24_4_ = fStack_288 * auVar93._24_4_;
    auVar100._28_4_ = 0x80000000;
    auVar94 = vmulps_avx512vl(local_2c0,auVar93);
    auVar101._4_4_ = (float)local_200._4_4_ * auVar93._4_4_;
    auVar101._0_4_ = (float)local_200._0_4_ * auVar93._0_4_;
    auVar101._8_4_ = fStack_1f8 * auVar93._8_4_;
    auVar101._12_4_ = fStack_1f4 * auVar93._12_4_;
    auVar101._16_4_ = fStack_1f0 * auVar93._16_4_;
    auVar101._20_4_ = fStack_1ec * auVar93._20_4_;
    auVar101._24_4_ = fStack_1e8 * auVar93._24_4_;
    auVar101._28_4_ = auVar114._28_4_;
    auVar93 = vmulps_avx512vl(local_220,auVar93);
    auVar95 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar86);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar269._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar87);
    auVar92 = vfmadd231ps_avx512vl(auVar93,local_1e0,auVar92);
    auVar93 = vfmadd231ps_avx512vl(auVar95,auVar89,local_280);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar83);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar89,auVar84);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar85,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar79);
    local_600 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar80);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar81);
    auVar93 = vfmadd231ps_avx512vl(auVar92,auVar82,auVar91);
    auVar102._4_4_ = (fVar239 + fVar239) * fVar235;
    auVar102._0_4_ = (fVar238 + fVar238) * fVar229;
    auVar102._8_4_ = (fVar258 + fVar258) * fVar236;
    auVar102._12_4_ = (fVar241 + fVar241) * fVar237;
    auVar102._16_4_ = (fVar142 + fVar142) * 0.0;
    auVar102._20_4_ = (fVar247 + fVar247) * 0.0;
    auVar102._24_4_ = (fVar248 + fVar248) * 0.0;
    auVar102._28_4_ = auVar89._28_4_;
    auVar91 = vsubps_avx(auVar102,auVar217._0_32_);
    auVar223._0_28_ =
         ZEXT1628(CONCAT412((fVar237 + fVar237) * auVar259._12_4_ + fVar257 * fVar237,
                            CONCAT48((fVar236 + fVar236) * auVar259._8_4_ + fVar256 * fVar236,
                                     CONCAT44((fVar235 + fVar235) * auVar259._4_4_ +
                                              fVar255 * fVar235,
                                              (fVar229 + fVar229) * auVar259._0_4_ +
                                              fVar252 * fVar229))));
    auVar223._28_4_ = auVar259._28_4_ + 0.0;
    auVar92._8_4_ = 0x40000000;
    auVar92._0_8_ = 0x4000000040000000;
    auVar92._12_4_ = 0x40000000;
    auVar92._16_4_ = 0x40000000;
    auVar92._20_4_ = 0x40000000;
    auVar92._24_4_ = 0x40000000;
    auVar92._28_4_ = 0x40000000;
    auVar89 = vaddps_avx512vl(auVar201._0_32_,auVar92);
    auVar103._4_4_ = (fVar239 + fVar239) * auVar89._4_4_;
    auVar103._0_4_ = (fVar238 + fVar238) * auVar89._0_4_;
    auVar103._8_4_ = (fVar258 + fVar258) * auVar89._8_4_;
    auVar103._12_4_ = (fVar241 + fVar241) * auVar89._12_4_;
    auVar103._16_4_ = (fVar142 + fVar142) * auVar89._16_4_;
    auVar103._20_4_ = (fVar247 + fVar247) * auVar89._20_4_;
    auVar103._24_4_ = (fVar248 + fVar248) * auVar89._24_4_;
    auVar103._28_4_ = auVar89._28_4_;
    auVar106._4_4_ = fVar239 * 3.0 * fVar239;
    auVar106._0_4_ = fVar238 * 3.0 * fVar238;
    auVar106._8_4_ = fVar258 * 3.0 * fVar258;
    auVar106._12_4_ = fVar241 * 3.0 * fVar241;
    auVar106._16_4_ = fVar142 * 3.0 * fVar142;
    auVar106._20_4_ = fVar247 * 3.0 * fVar247;
    auVar106._24_4_ = fVar248 * 3.0 * fVar248;
    auVar106._28_4_ = fVar253;
    auVar89 = vsubps_avx(auVar103,auVar106);
    auVar88 = vsubps_avx512vl(auVar88,auVar102);
    auVar92 = vmulps_avx512vl(auVar91,auVar90);
    auVar94 = vmulps_avx512vl(auVar223,auVar90);
    auVar89 = vmulps_avx512vl(auVar89,auVar90);
    auVar88 = vmulps_avx512vl(auVar88,auVar90);
    fVar229 = auVar88._0_4_;
    fVar235 = auVar88._4_4_;
    auVar107._4_4_ = fStack_29c * fVar235;
    auVar107._0_4_ = local_2a0 * fVar229;
    fVar236 = auVar88._8_4_;
    auVar107._8_4_ = fStack_298 * fVar236;
    fVar237 = auVar88._12_4_;
    auVar107._12_4_ = fStack_294 * fVar237;
    fVar238 = auVar88._16_4_;
    auVar107._16_4_ = fStack_290 * fVar238;
    fVar239 = auVar88._20_4_;
    auVar107._20_4_ = fStack_28c * fVar239;
    fVar258 = auVar88._24_4_;
    auVar107._24_4_ = fStack_288 * fVar258;
    auVar107._28_4_ = auVar259._28_4_;
    auVar108._4_4_ = fVar235 * local_2c0._4_4_;
    auVar108._0_4_ = fVar229 * local_2c0._0_4_;
    auVar108._8_4_ = fVar236 * local_2c0._8_4_;
    auVar108._12_4_ = fVar237 * local_2c0._12_4_;
    auVar108._16_4_ = fVar238 * local_2c0._16_4_;
    auVar108._20_4_ = fVar239 * local_2c0._20_4_;
    auVar108._24_4_ = fVar258 * local_2c0._24_4_;
    auVar108._28_4_ = fStack_284;
    auVar109._4_4_ = fVar235 * (float)local_200._4_4_;
    auVar109._0_4_ = fVar229 * (float)local_200._0_4_;
    auVar109._8_4_ = fVar236 * fStack_1f8;
    auVar109._12_4_ = fVar237 * fStack_1f4;
    auVar109._16_4_ = fVar238 * fStack_1f0;
    auVar109._20_4_ = fVar239 * fStack_1ec;
    auVar109._24_4_ = fVar258 * fStack_1e8;
    auVar109._28_4_ = fVar253 + fVar253;
    auVar88 = vmulps_avx512vl(local_220,auVar88);
    auVar90 = vfmadd231ps_avx512vl(auVar107,auVar89,auVar86);
    auVar95 = vfmadd231ps_avx512vl(auVar108,auVar89,auVar269._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar109,auVar89,auVar87);
    auVar89 = vfmadd231ps_avx512vl(auVar88,local_1e0,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar90,auVar94,local_280);
    auVar90 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar83);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar84);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar94);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar79);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar80);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar81);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar82,auVar92);
    auVar117._4_4_ = auVar88._4_4_ * fVar240;
    auVar117._0_4_ = auVar88._0_4_ * fVar240;
    auVar117._8_4_ = auVar88._8_4_ * fVar240;
    auVar117._12_4_ = auVar88._12_4_ * fVar240;
    auVar117._16_4_ = auVar88._16_4_ * fVar240;
    auVar117._20_4_ = auVar88._20_4_ * fVar240;
    auVar117._24_4_ = auVar88._24_4_ * fVar240;
    auVar117._28_4_ = auVar91._28_4_;
    auVar118._4_4_ = auVar90._4_4_ * fVar240;
    auVar118._0_4_ = auVar90._0_4_ * fVar240;
    auVar118._8_4_ = auVar90._8_4_ * fVar240;
    auVar118._12_4_ = auVar90._12_4_ * fVar240;
    auVar118._16_4_ = auVar90._16_4_ * fVar240;
    auVar118._20_4_ = auVar90._20_4_ * fVar240;
    auVar118._24_4_ = auVar90._24_4_ * fVar240;
    auVar118._28_4_ = auVar90._28_4_;
    auVar119._4_4_ = auVar94._4_4_ * fVar240;
    auVar119._0_4_ = auVar94._0_4_ * fVar240;
    auVar119._8_4_ = auVar94._8_4_ * fVar240;
    auVar119._12_4_ = auVar94._12_4_ * fVar240;
    auVar119._16_4_ = auVar94._16_4_ * fVar240;
    auVar119._20_4_ = auVar94._20_4_ * fVar240;
    auVar119._24_4_ = auVar94._24_4_ * fVar240;
    auVar119._28_4_ = auVar94._28_4_;
    fVar229 = auVar89._0_4_ * fVar240;
    fVar235 = auVar89._4_4_ * fVar240;
    auVar110._4_4_ = fVar235;
    auVar110._0_4_ = fVar229;
    fVar236 = auVar89._8_4_ * fVar240;
    auVar110._8_4_ = fVar236;
    fVar237 = auVar89._12_4_ * fVar240;
    auVar110._12_4_ = fVar237;
    fVar238 = auVar89._16_4_ * fVar240;
    auVar110._16_4_ = fVar238;
    fVar239 = auVar89._20_4_ * fVar240;
    auVar110._20_4_ = fVar239;
    fVar240 = auVar89._24_4_ * fVar240;
    auVar110._24_4_ = fVar240;
    auVar110._28_4_ = fStack_1e4;
    auVar65 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
    auVar92 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,ZEXT1632(auVar65));
    auVar251 = ZEXT3264(auVar92);
    auVar99 = vpermt2ps_avx512vl(local_600,_DAT_0205fd20,ZEXT1632(auVar65));
    auVar88 = ZEXT1632(auVar65);
    auVar100 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar88);
    auVar224._0_4_ = auVar93._0_4_ + fVar229;
    auVar224._4_4_ = auVar93._4_4_ + fVar235;
    auVar224._8_4_ = auVar93._8_4_ + fVar236;
    auVar224._12_4_ = auVar93._12_4_ + fVar237;
    auVar224._16_4_ = auVar93._16_4_ + fVar238;
    auVar224._20_4_ = auVar93._20_4_ + fVar239;
    auVar224._24_4_ = auVar93._24_4_ + fVar240;
    auVar224._28_4_ = auVar93._28_4_ + fStack_1e4;
    auVar91 = vmaxps_avx(auVar93,auVar224);
    auVar89 = vminps_avx(auVar93,auVar224);
    auVar94 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar88);
    auVar101 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar88);
    auVar102 = vpermt2ps_avx512vl(auVar118,_DAT_0205fd20,auVar88);
    auVar114 = ZEXT1632(auVar65);
    auVar103 = vpermt2ps_avx512vl(auVar119,_DAT_0205fd20,auVar114);
    auVar88 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar114);
    auVar95 = vsubps_avx512vl(auVar94,auVar88);
    auVar88 = vsubps_avx(auVar92,auVar97);
    auVar90 = vsubps_avx(auVar99,local_600);
    local_620 = vsubps_avx512vl(auVar100,auVar98);
    auVar93 = vmulps_avx512vl(auVar90,auVar119);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar118,local_620);
    auVar96 = vmulps_avx512vl(local_620,auVar117);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar119,auVar88);
    auVar104 = vmulps_avx512vl(auVar88,auVar118);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar117,auVar90);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar96 = vfmadd231ps_avx512vl(auVar104,auVar96,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar93);
    auVar93 = vmulps_avx512vl(local_620,local_620);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar90);
    auVar104 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar88);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar93._8_4_ = 0x3f800000;
    auVar93._0_8_ = &DAT_3f8000003f800000;
    auVar93._12_4_ = 0x3f800000;
    auVar93._16_4_ = 0x3f800000;
    auVar93._20_4_ = 0x3f800000;
    auVar93._24_4_ = 0x3f800000;
    auVar93._28_4_ = 0x3f800000;
    auVar93 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar93);
    auVar93 = vfmadd132ps_avx512vl(auVar93,auVar105,auVar105);
    auVar96 = vmulps_avx512vl(auVar96,auVar93);
    auVar105 = vmulps_avx512vl(auVar90,auVar103);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,local_620);
    auVar106 = vmulps_avx512vl(local_620,auVar101);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar88);
    auVar107 = vmulps_avx512vl(auVar88,auVar102);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar101,auVar90);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar93 = vmulps_avx512vl(auVar105,auVar93);
    auVar93 = vmaxps_avx512vl(auVar96,auVar93);
    auVar93 = vsqrtps_avx512vl(auVar93);
    auVar96 = vmaxps_avx512vl(auVar95,auVar94);
    auVar91 = vmaxps_avx512vl(auVar91,auVar96);
    auVar96 = vaddps_avx512vl(auVar93,auVar91);
    auVar91 = vminps_avx512vl(auVar95,auVar94);
    auVar91 = vminps_avx(auVar89,auVar91);
    auVar91 = vsubps_avx512vl(auVar91,auVar93);
    auVar94._8_4_ = 0x3f800002;
    auVar94._0_8_ = 0x3f8000023f800002;
    auVar94._12_4_ = 0x3f800002;
    auVar94._16_4_ = 0x3f800002;
    auVar94._20_4_ = 0x3f800002;
    auVar94._24_4_ = 0x3f800002;
    auVar94._28_4_ = 0x3f800002;
    auVar89 = vmulps_avx512vl(auVar96,auVar94);
    auVar95._8_4_ = 0x3f7ffffc;
    auVar95._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar95._12_4_ = 0x3f7ffffc;
    auVar95._16_4_ = 0x3f7ffffc;
    auVar95._20_4_ = 0x3f7ffffc;
    auVar95._24_4_ = 0x3f7ffffc;
    auVar95._28_4_ = 0x3f7ffffc;
    auVar93 = vmulps_avx512vl(auVar91,auVar95);
    auVar111._4_4_ = auVar89._4_4_ * auVar89._4_4_;
    auVar111._0_4_ = auVar89._0_4_ * auVar89._0_4_;
    auVar111._8_4_ = auVar89._8_4_ * auVar89._8_4_;
    auVar111._12_4_ = auVar89._12_4_ * auVar89._12_4_;
    auVar111._16_4_ = auVar89._16_4_ * auVar89._16_4_;
    auVar111._20_4_ = auVar89._20_4_ * auVar89._20_4_;
    auVar111._24_4_ = auVar89._24_4_ * auVar89._24_4_;
    auVar111._28_4_ = auVar93._28_4_;
    auVar91 = vrsqrt14ps_avx512vl(auVar104);
    auVar96._8_4_ = 0xbf000000;
    auVar96._0_8_ = 0xbf000000bf000000;
    auVar96._12_4_ = 0xbf000000;
    auVar96._16_4_ = 0xbf000000;
    auVar96._20_4_ = 0xbf000000;
    auVar96._24_4_ = 0xbf000000;
    auVar96._28_4_ = 0xbf000000;
    auVar89 = vmulps_avx512vl(auVar104,auVar96);
    auVar112._4_4_ = auVar91._4_4_ * auVar89._4_4_;
    auVar112._0_4_ = auVar91._0_4_ * auVar89._0_4_;
    auVar112._8_4_ = auVar91._8_4_ * auVar89._8_4_;
    auVar112._12_4_ = auVar91._12_4_ * auVar89._12_4_;
    auVar112._16_4_ = auVar91._16_4_ * auVar89._16_4_;
    auVar112._20_4_ = auVar91._20_4_ * auVar89._20_4_;
    auVar112._24_4_ = auVar91._24_4_ * auVar89._24_4_;
    auVar112._28_4_ = auVar89._28_4_;
    auVar89 = vmulps_avx512vl(auVar91,auVar91);
    auVar89 = vmulps_avx512vl(auVar89,auVar112);
    auVar104._8_4_ = 0x3fc00000;
    auVar104._0_8_ = 0x3fc000003fc00000;
    auVar104._12_4_ = 0x3fc00000;
    auVar104._16_4_ = 0x3fc00000;
    auVar104._20_4_ = 0x3fc00000;
    auVar104._24_4_ = 0x3fc00000;
    auVar104._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar104);
    auVar113._4_4_ = auVar94._4_4_ * auVar88._4_4_;
    auVar113._0_4_ = auVar94._0_4_ * auVar88._0_4_;
    auVar113._8_4_ = auVar94._8_4_ * auVar88._8_4_;
    auVar113._12_4_ = auVar94._12_4_ * auVar88._12_4_;
    auVar113._16_4_ = auVar94._16_4_ * auVar88._16_4_;
    auVar113._20_4_ = auVar94._20_4_ * auVar88._20_4_;
    auVar113._24_4_ = auVar94._24_4_ * auVar88._24_4_;
    auVar113._28_4_ = auVar91._28_4_;
    auVar91 = vmulps_avx512vl(auVar90,auVar94);
    auVar89 = vmulps_avx512vl(local_620,auVar94);
    auVar95 = vsubps_avx512vl(auVar114,auVar97);
    auVar96 = vsubps_avx512vl(auVar114,local_600);
    auVar104 = vsubps_avx512vl(auVar114,auVar98);
    auVar105 = vmulps_avx512vl(local_460,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_5e0,auVar96);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar78,auVar95);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar96);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar95,auVar95);
    auVar107 = vmulps_avx512vl(local_460,auVar89);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar91,local_5e0);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar78);
    auVar89 = vmulps_avx512vl(auVar104,auVar89);
    auVar91 = vfmadd231ps_avx512vl(auVar89,auVar96,auVar91);
    auVar108 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar113);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar91 = vsubps_avx(local_240,auVar109);
    auVar89 = vmulps_avx512vl(auVar107,auVar108);
    auVar89 = vsubps_avx512vl(auVar105,auVar89);
    auVar110 = vaddps_avx512vl(auVar89,auVar89);
    auVar89 = vmulps_avx512vl(auVar108,auVar108);
    auVar106 = vsubps_avx512vl(auVar106,auVar89);
    auVar89 = vsubps_avx(auVar106,auVar111);
    auVar111 = vmulps_avx512vl(auVar110,auVar110);
    auVar105._8_4_ = 0x40800000;
    auVar105._0_8_ = 0x4080000040800000;
    auVar105._12_4_ = 0x40800000;
    auVar105._16_4_ = 0x40800000;
    auVar105._20_4_ = 0x40800000;
    auVar105._24_4_ = 0x40800000;
    auVar105._28_4_ = 0x40800000;
    auVar105 = vmulps_avx512vl(auVar91,auVar105);
    auVar112 = vmulps_avx512vl(auVar105,auVar89);
    auVar112 = vsubps_avx512vl(auVar111,auVar112);
    uVar63 = vcmpps_avx512vl(auVar112,auVar114,5);
    bVar52 = (byte)uVar63;
    if (bVar52 == 0) {
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar113 = vaddps_avx512vl(auVar91,auVar91);
      auVar114 = vrcp14ps_avx512vl(auVar113);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = &DAT_3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22._16_4_ = 0x3f800000;
      auVar22._20_4_ = 0x3f800000;
      auVar22._24_4_ = 0x3f800000;
      auVar22._28_4_ = 0x3f800000;
      auVar113 = vfnmadd213ps_avx512vl(auVar113,auVar114,auVar22);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar114,auVar114);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23._16_4_ = 0x80000000;
      auVar23._20_4_ = 0x80000000;
      auVar23._24_4_ = 0x80000000;
      auVar23._28_4_ = 0x80000000;
      auVar114 = vxorps_avx512vl(auVar110,auVar23);
      auVar114 = vsubps_avx512vl(auVar114,auVar112);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar112 = vsubps_avx512vl(auVar112,auVar110);
      auVar112 = vmulps_avx512vl(auVar112,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar108);
      local_540 = vmulps_avx512vl(auVar94,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar112,auVar108);
      local_560 = vmulps_avx512vl(auVar94,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar113,auVar114);
      auVar115._0_4_ =
           (uint)(bVar52 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar52 & 1) * local_560._0_4_;
      bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar60 * auVar113._4_4_ | (uint)!bVar60 * local_560._4_4_;
      bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar60 * auVar113._8_4_ | (uint)!bVar60 * local_560._8_4_;
      bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar60 * auVar113._12_4_ | (uint)!bVar60 * local_560._12_4_;
      bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar60 * auVar113._16_4_ | (uint)!bVar60 * local_560._16_4_;
      bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar60 * auVar113._20_4_ | (uint)!bVar60 * local_560._20_4_;
      bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar60 * auVar113._24_4_ | (uint)!bVar60 * local_560._24_4_;
      bVar60 = SUB81(uVar63 >> 7,0);
      auVar115._28_4_ = (uint)bVar60 * auVar113._28_4_ | (uint)!bVar60 * local_560._28_4_;
      auVar211._8_4_ = 0xff800000;
      auVar211._0_8_ = 0xff800000ff800000;
      auVar211._12_4_ = 0xff800000;
      auVar211._16_4_ = 0xff800000;
      auVar211._20_4_ = 0xff800000;
      auVar211._24_4_ = 0xff800000;
      auVar211._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar211,auVar112);
      auVar116._0_4_ =
           (uint)(bVar52 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar112._0_4_;
      bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar60 * auVar113._4_4_ | (uint)!bVar60 * auVar112._4_4_;
      bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar60 * auVar113._8_4_ | (uint)!bVar60 * auVar112._8_4_;
      bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar60 * auVar113._12_4_ | (uint)!bVar60 * auVar112._12_4_;
      bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar60 * auVar113._16_4_ | (uint)!bVar60 * auVar112._16_4_;
      bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar60 * auVar113._20_4_ | (uint)!bVar60 * auVar112._20_4_;
      bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar60 * auVar113._24_4_ | (uint)!bVar60 * auVar112._24_4_;
      bVar60 = SUB81(uVar63 >> 7,0);
      auVar116._28_4_ = (uint)bVar60 * auVar113._28_4_ | (uint)!bVar60 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar109);
      auVar113 = vmaxps_avx512vl(local_480,auVar112);
      auVar24._8_4_ = 0x36000000;
      auVar24._0_8_ = 0x3600000036000000;
      auVar24._12_4_ = 0x36000000;
      auVar24._16_4_ = 0x36000000;
      auVar24._20_4_ = 0x36000000;
      auVar24._24_4_ = 0x36000000;
      auVar24._28_4_ = 0x36000000;
      auVar113 = vmulps_avx512vl(auVar113,auVar24);
      vandps_avx512vl(auVar91,auVar112);
      uVar53 = vcmpps_avx512vl(auVar113,auVar113,1);
      uVar63 = uVar63 & uVar53;
      bVar55 = (byte)uVar63;
      if (bVar55 != 0) {
        uVar53 = vcmpps_avx512vl(auVar89,_DAT_02020f00,2);
        auVar225._8_4_ = 0xff800000;
        auVar225._0_8_ = 0xff800000ff800000;
        auVar225._12_4_ = 0xff800000;
        auVar225._16_4_ = 0xff800000;
        auVar225._20_4_ = 0xff800000;
        auVar225._24_4_ = 0xff800000;
        auVar225._28_4_ = 0xff800000;
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vblendmps_avx512vl(auVar89,auVar225);
        bVar51 = (byte)uVar53;
        uVar64 = (uint)(bVar51 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar113._0_4_;
        bVar60 = (bool)((byte)(uVar53 >> 1) & 1);
        uVar134 = (uint)bVar60 * auVar112._4_4_ | (uint)!bVar60 * auVar113._4_4_;
        bVar60 = (bool)((byte)(uVar53 >> 2) & 1);
        uVar135 = (uint)bVar60 * auVar112._8_4_ | (uint)!bVar60 * auVar113._8_4_;
        bVar60 = (bool)((byte)(uVar53 >> 3) & 1);
        uVar136 = (uint)bVar60 * auVar112._12_4_ | (uint)!bVar60 * auVar113._12_4_;
        bVar60 = (bool)((byte)(uVar53 >> 4) & 1);
        uVar137 = (uint)bVar60 * auVar112._16_4_ | (uint)!bVar60 * auVar113._16_4_;
        bVar60 = (bool)((byte)(uVar53 >> 5) & 1);
        uVar138 = (uint)bVar60 * auVar112._20_4_ | (uint)!bVar60 * auVar113._20_4_;
        bVar60 = (bool)((byte)(uVar53 >> 6) & 1);
        uVar139 = (uint)bVar60 * auVar112._24_4_ | (uint)!bVar60 * auVar113._24_4_;
        bVar60 = SUB81(uVar53 >> 7,0);
        uVar140 = (uint)bVar60 * auVar112._28_4_ | (uint)!bVar60 * auVar113._28_4_;
        auVar115._0_4_ = (bVar55 & 1) * uVar64 | !(bool)(bVar55 & 1) * auVar115._0_4_;
        bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar115._4_4_ = bVar60 * uVar134 | !bVar60 * auVar115._4_4_;
        bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar115._8_4_ = bVar60 * uVar135 | !bVar60 * auVar115._8_4_;
        bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar115._12_4_ = bVar60 * uVar136 | !bVar60 * auVar115._12_4_;
        bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar115._16_4_ = bVar60 * uVar137 | !bVar60 * auVar115._16_4_;
        bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar115._20_4_ = bVar60 * uVar138 | !bVar60 * auVar115._20_4_;
        bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar115._24_4_ = bVar60 * uVar139 | !bVar60 * auVar115._24_4_;
        bVar60 = SUB81(uVar63 >> 7,0);
        auVar115._28_4_ = bVar60 * uVar140 | !bVar60 * auVar115._28_4_;
        auVar89 = vblendmps_avx512vl(auVar225,auVar89);
        bVar60 = (bool)((byte)(uVar53 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar53 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar53 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
        bVar11 = SUB81(uVar53 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar55 & 1) *
             ((uint)(bVar51 & 1) * auVar89._0_4_ | !(bool)(bVar51 & 1) * uVar64) |
             !(bool)(bVar55 & 1) * auVar116._0_4_;
        bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar5 * ((uint)bVar60 * auVar89._4_4_ | !bVar60 * uVar134) |
             !bVar5 * auVar116._4_4_;
        bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar60 * ((uint)bVar6 * auVar89._8_4_ | !bVar6 * uVar135) |
             !bVar60 * auVar116._8_4_;
        bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar60 * ((uint)bVar7 * auVar89._12_4_ | !bVar7 * uVar136) |
             !bVar60 * auVar116._12_4_;
        bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar60 * ((uint)bVar8 * auVar89._16_4_ | !bVar8 * uVar137) |
             !bVar60 * auVar116._16_4_;
        bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar60 * ((uint)bVar9 * auVar89._20_4_ | !bVar9 * uVar138) |
             !bVar60 * auVar116._20_4_;
        bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar60 * ((uint)bVar10 * auVar89._24_4_ | !bVar10 * uVar139) |
             !bVar60 * auVar116._24_4_;
        bVar60 = SUB81(uVar63 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar60 * ((uint)bVar11 * auVar89._28_4_ | !bVar11 * uVar140) |
             !bVar60 * auVar116._28_4_;
        bVar52 = (~bVar55 | bVar51) & bVar52;
      }
    }
    if ((bVar52 & 0x7f) == 0) {
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar120._16_4_ = 0x3f800000;
      auVar120._20_4_ = 0x3f800000;
      auVar120._24_4_ = 0x3f800000;
      auVar120._28_4_ = 0x3f800000;
LAB_01b561ea:
      auVar217 = ZEXT3264(_DAT_02020f20);
      auVar261 = ZEXT3264(auVar117);
      auVar254 = ZEXT3264(auVar99);
      auVar201 = ZEXT3264(auVar120);
      auVar269 = ZEXT3264(local_7a0);
    }
    else {
      fVar229 = *(float *)(ray + k * 4 + 0x100) - (float)local_6a0._0_4_;
      auVar212._4_4_ = fVar229;
      auVar212._0_4_ = fVar229;
      auVar212._8_4_ = fVar229;
      auVar212._12_4_ = fVar229;
      auVar212._16_4_ = fVar229;
      auVar212._20_4_ = fVar229;
      auVar212._24_4_ = fVar229;
      auVar212._28_4_ = fVar229;
      auVar112 = vminps_avx512vl(auVar212,auVar116);
      auVar48._4_4_ = fStack_25c;
      auVar48._0_4_ = local_260;
      auVar48._8_4_ = fStack_258;
      auVar48._12_4_ = fStack_254;
      auVar48._16_4_ = fStack_250;
      auVar48._20_4_ = fStack_24c;
      auVar48._24_4_ = fStack_248;
      auVar48._28_4_ = fStack_244;
      auVar89 = vmaxps_avx512vl(auVar48,auVar115);
      auVar104 = vmulps_avx512vl(auVar104,auVar119);
      auVar96 = vfmadd213ps_avx512vl(auVar96,auVar118,auVar104);
      auVar95 = vfmadd213ps_avx512vl(auVar95,auVar117,auVar96);
      auVar96 = vmulps_avx512vl(local_460,auVar119);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_5e0,auVar118);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar78,auVar117);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar96,auVar117);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar117,auVar118,1);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = vxorps_avx512vl(auVar95,auVar119);
      auVar104 = vrcp14ps_avx512vl(auVar96);
      auVar113 = vxorps_avx512vl(auVar96,auVar119);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar114 = vfnmadd213ps_avx512vl(auVar104,auVar96,auVar120);
      auVar114 = vfmadd132ps_avx512vl(auVar114,auVar104,auVar104);
      auVar95 = vmulps_avx512vl(auVar114,auVar95);
      uVar13 = vcmpps_avx512vl(auVar96,auVar113,1);
      bVar55 = (byte)uVar12 | (byte)uVar13;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar95,auVar114);
      auVar122._0_4_ =
           (uint)(bVar55 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar104._0_4_;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar60 * auVar121._4_4_ | (uint)!bVar60 * auVar104._4_4_;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar60 * auVar121._8_4_ | (uint)!bVar60 * auVar104._8_4_;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar60 * auVar121._12_4_ | (uint)!bVar60 * auVar104._12_4_;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar60 * auVar121._16_4_ | (uint)!bVar60 * auVar104._16_4_;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar60 * auVar121._20_4_ | (uint)!bVar60 * auVar104._20_4_;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar60 * auVar121._24_4_ | (uint)!bVar60 * auVar104._24_4_;
      auVar122._28_4_ =
           (uint)(bVar55 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar104._28_4_;
      auVar89 = vmaxps_avx(auVar89,auVar122);
      uVar13 = vcmpps_avx512vl(auVar96,auVar113,6);
      bVar55 = (byte)uVar12 | (byte)uVar13;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123._0_4_ =
           (uint)(bVar55 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar95._0_4_;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar60 * auVar113._4_4_ | (uint)!bVar60 * auVar95._4_4_;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar60 * auVar113._8_4_ | (uint)!bVar60 * auVar95._8_4_;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar60 * auVar113._12_4_ | (uint)!bVar60 * auVar95._12_4_;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar60 * auVar113._16_4_ | (uint)!bVar60 * auVar95._16_4_;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar60 * auVar113._20_4_ | (uint)!bVar60 * auVar95._20_4_;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar60 * auVar113._24_4_ | (uint)!bVar60 * auVar95._24_4_;
      auVar123._28_4_ =
           (uint)(bVar55 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar95._28_4_;
      auVar95 = vminps_avx(auVar112,auVar123);
      auVar92 = vsubps_avx(ZEXT832(0) << 0x20,auVar92);
      auVar96 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
      auVar112 = ZEXT832(0) << 0x20;
      auVar104 = vsubps_avx(auVar112,auVar100);
      auVar33._4_4_ = auVar104._4_4_ * auVar103._4_4_;
      auVar33._0_4_ = auVar104._0_4_ * auVar103._0_4_;
      auVar33._8_4_ = auVar104._8_4_ * auVar103._8_4_;
      auVar33._12_4_ = auVar104._12_4_ * auVar103._12_4_;
      auVar33._16_4_ = auVar104._16_4_ * auVar103._16_4_;
      auVar33._20_4_ = auVar104._20_4_ * auVar103._20_4_;
      auVar33._24_4_ = auVar104._24_4_ * auVar103._24_4_;
      auVar33._28_4_ = auVar104._28_4_;
      auVar96 = vfnmsub231ps_avx512vl(auVar33,auVar102,auVar96);
      auVar92 = vfnmadd231ps_avx512vl(auVar96,auVar101,auVar92);
      auVar96 = vmulps_avx512vl(local_460,auVar103);
      auVar96 = vfnmsub231ps_avx512vl(auVar96,local_5e0,auVar102);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar78,auVar101);
      vandps_avx512vl(auVar96,auVar117);
      uVar12 = vcmpps_avx512vl(auVar96,auVar118,1);
      auVar92 = vxorps_avx512vl(auVar92,auVar119);
      auVar104 = vrcp14ps_avx512vl(auVar96);
      auVar117 = vxorps_avx512vl(auVar96,auVar119);
      auVar100 = vfnmadd213ps_avx512vl(auVar104,auVar96,auVar120);
      auVar65 = vfmadd132ps_fma(auVar100,auVar104,auVar104);
      fVar229 = auVar65._0_4_ * auVar92._0_4_;
      fVar235 = auVar65._4_4_ * auVar92._4_4_;
      auVar34._4_4_ = fVar235;
      auVar34._0_4_ = fVar229;
      fVar236 = auVar65._8_4_ * auVar92._8_4_;
      auVar34._8_4_ = fVar236;
      fVar237 = auVar65._12_4_ * auVar92._12_4_;
      auVar34._12_4_ = fVar237;
      fVar238 = auVar92._16_4_ * 0.0;
      auVar34._16_4_ = fVar238;
      fVar239 = auVar92._20_4_ * 0.0;
      auVar34._20_4_ = fVar239;
      fVar258 = auVar92._24_4_ * 0.0;
      auVar34._24_4_ = fVar258;
      auVar34._28_4_ = auVar92._28_4_;
      uVar13 = vcmpps_avx512vl(auVar96,auVar117,1);
      bVar55 = (byte)uVar12 | (byte)uVar13;
      auVar100 = vblendmps_avx512vl(auVar34,auVar114);
      auVar124._0_4_ =
           (uint)(bVar55 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar104._0_4_;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar60 * auVar100._4_4_ | (uint)!bVar60 * auVar104._4_4_;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar60 * auVar100._8_4_ | (uint)!bVar60 * auVar104._8_4_;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar60 * auVar100._12_4_ | (uint)!bVar60 * auVar104._12_4_;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar60 * auVar100._16_4_ | (uint)!bVar60 * auVar104._16_4_;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar60 * auVar100._20_4_ | (uint)!bVar60 * auVar104._20_4_;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar60 * auVar100._24_4_ | (uint)!bVar60 * auVar104._24_4_;
      auVar124._28_4_ =
           (uint)(bVar55 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar104._28_4_;
      _local_640 = vmaxps_avx(auVar89,auVar124);
      uVar13 = vcmpps_avx512vl(auVar96,auVar117,6);
      bVar55 = (byte)uVar12 | (byte)uVar13;
      auVar99._0_4_ = (uint)(bVar55 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar229
      ;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar99._4_4_ = (uint)bVar60 * auVar113._4_4_ | (uint)!bVar60 * (int)fVar235;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar99._8_4_ = (uint)bVar60 * auVar113._8_4_ | (uint)!bVar60 * (int)fVar236;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar99._12_4_ = (uint)bVar60 * auVar113._12_4_ | (uint)!bVar60 * (int)fVar237;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar99._16_4_ = (uint)bVar60 * auVar113._16_4_ | (uint)!bVar60 * (int)fVar238;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar99._20_4_ = (uint)bVar60 * auVar113._20_4_ | (uint)!bVar60 * (int)fVar239;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar99._24_4_ = (uint)bVar60 * auVar113._24_4_ | (uint)!bVar60 * (int)fVar258;
      auVar99._28_4_ =
           (uint)(bVar55 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar92._28_4_;
      local_300 = vminps_avx(auVar95,auVar99);
      auVar251 = ZEXT3264(local_300);
      uVar12 = vcmpps_avx512vl(_local_640,local_300,2);
      bVar52 = bVar52 & 0x7f & (byte)uVar12;
      if (bVar52 == 0) goto LAB_01b561ea;
      auVar89 = vmaxps_avx(auVar112,auVar93);
      auVar92 = vminps_avx512vl(local_540,auVar120);
      auVar39 = ZEXT412(0);
      auVar93 = ZEXT1232(auVar39) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT1232(auVar39) << 0x20);
      auVar95 = vminps_avx512vl(local_560,auVar120);
      auVar35._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar92._28_4_ + 7.0;
      auVar65 = vfmadd213ps_fma(auVar35,auVar153,auVar222);
      local_540 = ZEXT1632(auVar65);
      auVar92 = vmaxps_avx(auVar95,ZEXT1232(auVar39) << 0x20);
      auVar36._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar92._28_4_ + 7.0;
      auVar65 = vfmadd213ps_fma(auVar36,auVar153,auVar222);
      local_560 = ZEXT1632(auVar65);
      auVar213._0_4_ = auVar89._0_4_ * auVar89._0_4_;
      auVar213._4_4_ = auVar89._4_4_ * auVar89._4_4_;
      auVar213._8_4_ = auVar89._8_4_ * auVar89._8_4_;
      auVar213._12_4_ = auVar89._12_4_ * auVar89._12_4_;
      auVar213._16_4_ = auVar89._16_4_ * auVar89._16_4_;
      auVar213._20_4_ = auVar89._20_4_ * auVar89._20_4_;
      auVar213._24_4_ = auVar89._24_4_ * auVar89._24_4_;
      auVar213._28_4_ = 0;
      auVar89 = vsubps_avx(auVar106,auVar213);
      auVar261 = ZEXT3264(auVar89);
      auVar92 = vmulps_avx512vl(auVar105,auVar89);
      auVar92 = vsubps_avx512vl(auVar111,auVar92);
      uVar12 = vcmpps_avx512vl(auVar92,ZEXT1232(auVar39) << 0x20,5);
      bVar55 = (byte)uVar12;
      if (bVar55 == 0) {
        auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar88 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar254 = ZEXT864(0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
      }
      else {
        auVar69 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
        uVar63 = vcmpps_avx512vl(auVar92,auVar112,5);
        auVar92 = vsqrtps_avx(auVar92);
        auVar226._0_4_ = auVar91._0_4_ + auVar91._0_4_;
        auVar226._4_4_ = auVar91._4_4_ + auVar91._4_4_;
        auVar226._8_4_ = auVar91._8_4_ + auVar91._8_4_;
        auVar226._12_4_ = auVar91._12_4_ + auVar91._12_4_;
        auVar226._16_4_ = auVar91._16_4_ + auVar91._16_4_;
        auVar226._20_4_ = auVar91._20_4_ + auVar91._20_4_;
        auVar226._24_4_ = auVar91._24_4_ + auVar91._24_4_;
        auVar226._28_4_ = auVar91._28_4_ + auVar91._28_4_;
        auVar93 = vrcp14ps_avx512vl(auVar226);
        auVar95 = vfnmadd213ps_avx512vl(auVar226,auVar93,auVar120);
        auVar65 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
        auVar25._8_4_ = 0x80000000;
        auVar25._0_8_ = 0x8000000080000000;
        auVar25._12_4_ = 0x80000000;
        auVar25._16_4_ = 0x80000000;
        auVar25._20_4_ = 0x80000000;
        auVar25._24_4_ = 0x80000000;
        auVar25._28_4_ = 0x80000000;
        auVar93 = vxorps_avx512vl(auVar110,auVar25);
        auVar93 = vsubps_avx(auVar93,auVar92);
        auVar37._4_4_ = auVar93._4_4_ * auVar65._4_4_;
        auVar37._0_4_ = auVar93._0_4_ * auVar65._0_4_;
        auVar37._8_4_ = auVar93._8_4_ * auVar65._8_4_;
        auVar37._12_4_ = auVar93._12_4_ * auVar65._12_4_;
        auVar37._16_4_ = auVar93._16_4_ * 0.0;
        auVar37._20_4_ = auVar93._20_4_ * 0.0;
        auVar37._24_4_ = auVar93._24_4_ * 0.0;
        auVar37._28_4_ = 0x3e000000;
        auVar92 = vsubps_avx512vl(auVar92,auVar110);
        auVar268._0_4_ = auVar92._0_4_ * auVar65._0_4_;
        auVar268._4_4_ = auVar92._4_4_ * auVar65._4_4_;
        auVar268._8_4_ = auVar92._8_4_ * auVar65._8_4_;
        auVar268._12_4_ = auVar92._12_4_ * auVar65._12_4_;
        auVar268._16_4_ = auVar92._16_4_ * 0.0;
        auVar268._20_4_ = auVar92._20_4_ * 0.0;
        auVar268._24_4_ = auVar92._24_4_ * 0.0;
        auVar268._28_4_ = 0;
        auVar65 = vfmadd213ps_fma(auVar107,auVar37,auVar108);
        auVar38._4_4_ = auVar94._4_4_ * auVar65._4_4_;
        auVar38._0_4_ = auVar94._0_4_ * auVar65._0_4_;
        auVar38._8_4_ = auVar94._8_4_ * auVar65._8_4_;
        auVar38._12_4_ = auVar94._12_4_ * auVar65._12_4_;
        auVar38._16_4_ = auVar94._16_4_ * 0.0;
        auVar38._20_4_ = auVar94._20_4_ * 0.0;
        auVar38._24_4_ = auVar94._24_4_ * 0.0;
        auVar38._28_4_ = auVar93._28_4_;
        auVar92 = vmulps_avx512vl(auVar78,auVar37);
        auVar93 = vmulps_avx512vl(local_5e0,auVar37);
        auVar96 = vmulps_avx512vl(local_460,auVar37);
        auVar95 = vfmadd213ps_avx512vl(auVar88,auVar38,auVar97);
        auVar92 = vsubps_avx512vl(auVar92,auVar95);
        auVar95 = vfmadd213ps_avx512vl(auVar90,auVar38,local_600);
        auVar95 = vsubps_avx512vl(auVar93,auVar95);
        auVar65 = vfmadd213ps_fma(auVar38,local_620,auVar98);
        auVar93 = vsubps_avx(auVar96,ZEXT1632(auVar65));
        auVar254 = ZEXT3264(auVar93);
        auVar93 = vfmadd213ps_avx512vl(auVar107,auVar268,auVar108);
        auVar94 = vmulps_avx512vl(auVar94,auVar93);
        auVar93 = vmulps_avx512vl(auVar78,auVar268);
        auVar96 = vmulps_avx512vl(local_5e0,auVar268);
        auVar104 = vmulps_avx512vl(local_460,auVar268);
        auVar88 = vfmadd213ps_avx512vl(auVar88,auVar94,auVar97);
        auVar93 = vsubps_avx(auVar93,auVar88);
        auVar65 = vfmadd213ps_fma(auVar90,auVar94,local_600);
        auVar90 = vsubps_avx512vl(auVar96,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(local_620,auVar94,auVar98);
        auVar88 = vsubps_avx(auVar104,ZEXT1632(auVar65));
        auVar154._8_4_ = 0x7f800000;
        auVar154._0_8_ = 0x7f8000007f800000;
        auVar154._12_4_ = 0x7f800000;
        auVar154._16_4_ = 0x7f800000;
        auVar154._20_4_ = 0x7f800000;
        auVar154._24_4_ = 0x7f800000;
        auVar154._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar154,auVar37);
        bVar60 = (bool)((byte)uVar63 & 1);
        auVar125._0_4_ = (uint)bVar60 * auVar94._0_4_ | (uint)!bVar60 * auVar104._0_4_;
        bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar60 * auVar94._4_4_ | (uint)!bVar60 * auVar104._4_4_;
        bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar60 * auVar94._8_4_ | (uint)!bVar60 * auVar104._8_4_;
        bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar60 * auVar94._12_4_ | (uint)!bVar60 * auVar104._12_4_;
        bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar60 * auVar94._16_4_ | (uint)!bVar60 * auVar104._16_4_;
        bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar60 * auVar94._20_4_ | (uint)!bVar60 * auVar104._20_4_;
        bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar60 * auVar94._24_4_ | (uint)!bVar60 * auVar104._24_4_;
        bVar60 = SUB81(uVar63 >> 7,0);
        auVar125._28_4_ = (uint)bVar60 * auVar94._28_4_ | (uint)!bVar60 * auVar104._28_4_;
        auVar155._8_4_ = 0xff800000;
        auVar155._0_8_ = 0xff800000ff800000;
        auVar155._12_4_ = 0xff800000;
        auVar155._16_4_ = 0xff800000;
        auVar155._20_4_ = 0xff800000;
        auVar155._24_4_ = 0xff800000;
        auVar155._28_4_ = 0xff800000;
        auVar94 = vblendmps_avx512vl(auVar155,auVar268);
        bVar60 = (bool)((byte)uVar63 & 1);
        auVar126._0_4_ = (uint)bVar60 * auVar94._0_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar60 * auVar94._4_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar60 * auVar94._8_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar60 * auVar94._12_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar60 * auVar94._16_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar60 * auVar94._20_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar60 * auVar94._24_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = SUB81(uVar63 >> 7,0);
        auVar126._28_4_ = (uint)bVar60 * auVar94._28_4_ | (uint)!bVar60 * -0x800000;
        auVar245._8_4_ = 0x7fffffff;
        auVar245._0_8_ = 0x7fffffff7fffffff;
        auVar245._12_4_ = 0x7fffffff;
        auVar245._16_4_ = 0x7fffffff;
        auVar245._20_4_ = 0x7fffffff;
        auVar245._24_4_ = 0x7fffffff;
        auVar245._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(auVar245,auVar109);
        auVar94 = vmaxps_avx(local_480,auVar94);
        auVar26._8_4_ = 0x36000000;
        auVar26._0_8_ = 0x3600000036000000;
        auVar26._12_4_ = 0x36000000;
        auVar26._16_4_ = 0x36000000;
        auVar26._20_4_ = 0x36000000;
        auVar26._24_4_ = 0x36000000;
        auVar26._28_4_ = 0x36000000;
        auVar94 = vmulps_avx512vl(auVar94,auVar26);
        auVar91 = vandps_avx(auVar91,auVar245);
        uVar53 = vcmpps_avx512vl(auVar91,auVar94,1);
        uVar63 = uVar63 & uVar53;
        bVar51 = (byte)uVar63;
        if (bVar51 != 0) {
          uVar53 = vcmpps_avx512vl(auVar89,ZEXT1632(auVar69),2);
          auVar246._8_4_ = 0xff800000;
          auVar246._0_8_ = 0xff800000ff800000;
          auVar246._12_4_ = 0xff800000;
          auVar246._16_4_ = 0xff800000;
          auVar246._20_4_ = 0xff800000;
          auVar246._24_4_ = 0xff800000;
          auVar246._28_4_ = 0xff800000;
          auVar260._8_4_ = 0x7f800000;
          auVar260._0_8_ = 0x7f8000007f800000;
          auVar260._12_4_ = 0x7f800000;
          auVar260._16_4_ = 0x7f800000;
          auVar260._20_4_ = 0x7f800000;
          auVar260._24_4_ = 0x7f800000;
          auVar260._28_4_ = 0x7f800000;
          auVar261 = ZEXT3264(auVar260);
          auVar91 = vblendmps_avx512vl(auVar260,auVar246);
          bVar54 = (byte)uVar53;
          uVar64 = (uint)(bVar54 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar94._0_4_;
          bVar60 = (bool)((byte)(uVar53 >> 1) & 1);
          uVar134 = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * auVar94._4_4_;
          bVar60 = (bool)((byte)(uVar53 >> 2) & 1);
          uVar135 = (uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * auVar94._8_4_;
          bVar60 = (bool)((byte)(uVar53 >> 3) & 1);
          uVar136 = (uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * auVar94._12_4_;
          bVar60 = (bool)((byte)(uVar53 >> 4) & 1);
          uVar137 = (uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * auVar94._16_4_;
          bVar60 = (bool)((byte)(uVar53 >> 5) & 1);
          uVar138 = (uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * auVar94._20_4_;
          bVar60 = (bool)((byte)(uVar53 >> 6) & 1);
          uVar139 = (uint)bVar60 * auVar91._24_4_ | (uint)!bVar60 * auVar94._24_4_;
          bVar60 = SUB81(uVar53 >> 7,0);
          uVar140 = (uint)bVar60 * auVar91._28_4_ | (uint)!bVar60 * auVar94._28_4_;
          auVar125._0_4_ = (bVar51 & 1) * uVar64 | !(bool)(bVar51 & 1) * auVar125._0_4_;
          bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar125._4_4_ = bVar60 * uVar134 | !bVar60 * auVar125._4_4_;
          bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar125._8_4_ = bVar60 * uVar135 | !bVar60 * auVar125._8_4_;
          bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar125._12_4_ = bVar60 * uVar136 | !bVar60 * auVar125._12_4_;
          bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar125._16_4_ = bVar60 * uVar137 | !bVar60 * auVar125._16_4_;
          bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar125._20_4_ = bVar60 * uVar138 | !bVar60 * auVar125._20_4_;
          bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar125._24_4_ = bVar60 * uVar139 | !bVar60 * auVar125._24_4_;
          bVar60 = SUB81(uVar63 >> 7,0);
          auVar125._28_4_ = bVar60 * uVar140 | !bVar60 * auVar125._28_4_;
          auVar91 = vblendmps_avx512vl(auVar246,auVar260);
          bVar60 = (bool)((byte)(uVar53 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar53 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar53 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
          bVar11 = SUB81(uVar53 >> 7,0);
          auVar126._0_4_ =
               (uint)(bVar51 & 1) *
               ((uint)(bVar54 & 1) * auVar91._0_4_ | !(bool)(bVar54 & 1) * uVar64) |
               !(bool)(bVar51 & 1) * auVar126._0_4_;
          bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar126._4_4_ =
               (uint)bVar5 * ((uint)bVar60 * auVar91._4_4_ | !bVar60 * uVar134) |
               !bVar5 * auVar126._4_4_;
          bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar126._8_4_ =
               (uint)bVar60 * ((uint)bVar6 * auVar91._8_4_ | !bVar6 * uVar135) |
               !bVar60 * auVar126._8_4_;
          bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar126._12_4_ =
               (uint)bVar60 * ((uint)bVar7 * auVar91._12_4_ | !bVar7 * uVar136) |
               !bVar60 * auVar126._12_4_;
          bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar126._16_4_ =
               (uint)bVar60 * ((uint)bVar8 * auVar91._16_4_ | !bVar8 * uVar137) |
               !bVar60 * auVar126._16_4_;
          bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar126._20_4_ =
               (uint)bVar60 * ((uint)bVar9 * auVar91._20_4_ | !bVar9 * uVar138) |
               !bVar60 * auVar126._20_4_;
          bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar126._24_4_ =
               (uint)bVar60 * ((uint)bVar10 * auVar91._24_4_ | !bVar10 * uVar139) |
               !bVar60 * auVar126._24_4_;
          bVar60 = SUB81(uVar63 >> 7,0);
          auVar126._28_4_ =
               (uint)bVar60 * ((uint)bVar11 * auVar91._28_4_ | !bVar11 * uVar140) |
               !bVar60 * auVar126._28_4_;
          bVar55 = (~bVar51 | bVar54) & bVar55;
        }
      }
      auVar269 = ZEXT3264(local_7a0);
      auVar91 = vmulps_avx512vl(local_460,auVar88);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_5e0,auVar90);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar78,auVar93);
      _local_1c0 = _local_640;
      local_1a0 = vminps_avx(local_300,auVar125);
      auVar234._8_4_ = 0x7fffffff;
      auVar234._0_8_ = 0x7fffffff7fffffff;
      auVar234._12_4_ = 0x7fffffff;
      auVar234._16_4_ = 0x7fffffff;
      auVar234._20_4_ = 0x7fffffff;
      auVar234._24_4_ = 0x7fffffff;
      auVar234._28_4_ = 0x7fffffff;
      auVar91 = vandps_avx(auVar91,auVar234);
      _local_5a0 = vmaxps_avx(_local_640,auVar126);
      _local_320 = _local_5a0;
      auVar156._8_4_ = 0x3e99999a;
      auVar156._0_8_ = 0x3e99999a3e99999a;
      auVar156._12_4_ = 0x3e99999a;
      auVar156._16_4_ = 0x3e99999a;
      auVar156._20_4_ = 0x3e99999a;
      auVar156._24_4_ = 0x3e99999a;
      auVar156._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar91,auVar156,1);
      uVar13 = vcmpps_avx512vl(_local_640,local_1a0,2);
      bVar51 = (byte)uVar13 & bVar52;
      uVar14 = vcmpps_avx512vl(_local_5a0,local_300,2);
      if ((bVar52 & ((byte)uVar14 | (byte)uVar13)) != 0) {
        auVar91 = vmulps_avx512vl(local_460,auVar254._0_32_);
        auVar91 = vfmadd213ps_avx512vl(auVar95,local_5e0,auVar91);
        auVar91 = vfmadd213ps_avx512vl(auVar92,auVar78,auVar91);
        auVar91 = vandps_avx(auVar91,auVar234);
        uVar13 = vcmpps_avx512vl(auVar91,auVar156,1);
        bVar54 = (byte)uVar13 | ~bVar55;
        auVar157._8_4_ = 2;
        auVar157._0_8_ = 0x200000002;
        auVar157._12_4_ = 2;
        auVar157._16_4_ = 2;
        auVar157._20_4_ = 2;
        auVar157._24_4_ = 2;
        auVar157._28_4_ = 2;
        auVar27._8_4_ = 3;
        auVar27._0_8_ = 0x300000003;
        auVar27._12_4_ = 3;
        auVar27._16_4_ = 3;
        auVar27._20_4_ = 3;
        auVar27._24_4_ = 3;
        auVar27._28_4_ = 3;
        auVar91 = vpblendmd_avx512vl(auVar157,auVar27);
        local_2e0._0_4_ = (uint)(bVar54 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
        bVar60 = (bool)(bVar54 >> 1 & 1);
        local_2e0._4_4_ = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 2 & 1);
        local_2e0._8_4_ = (uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 3 & 1);
        local_2e0._12_4_ = (uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 4 & 1);
        local_2e0._16_4_ = (uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 5 & 1);
        local_2e0._20_4_ = (uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 6 & 1);
        local_2e0._24_4_ = (uint)bVar60 * auVar91._24_4_ | (uint)!bVar60 * 2;
        local_2e0._28_4_ = (uint)(bVar54 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar13 = vpcmpd_avx512vl(local_4a0,local_2e0,5);
        bVar54 = (byte)uVar13 & bVar51;
        auVar129._16_16_ = auVar87._16_16_;
        if (bVar54 == 0) {
          auVar251 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        }
        else {
          auVar69 = vminps_avx(local_700._0_16_,local_740._0_16_);
          auVar65 = vmaxps_avx(local_700._0_16_,local_740._0_16_);
          auVar77 = vminps_avx(local_720._0_16_,local_760._0_16_);
          auVar66 = vminps_avx(auVar69,auVar77);
          auVar69 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
          auVar77 = vmaxps_avx(auVar65,auVar69);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar66,auVar185);
          auVar69 = vandps_avx(auVar77,auVar185);
          auVar65 = vmaxps_avx(auVar65,auVar69);
          auVar69 = vmovshdup_avx(auVar65);
          auVar69 = vmaxss_avx(auVar69,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar69);
          fVar229 = auVar65._0_4_ * 1.9073486e-06;
          local_6b0 = vshufps_avx(auVar77,auVar77,0xff);
          local_580 = (float)local_640._0_4_ + (float)local_5c0._0_4_;
          fStack_57c = (float)local_640._4_4_ + (float)local_5c0._4_4_;
          fStack_578 = fStack_638 + fStack_5b8;
          fStack_574 = fStack_634 + fStack_5b4;
          fStack_570 = fStack_630 + fStack_5b0;
          fStack_56c = fStack_62c + fStack_5ac;
          fStack_568 = fStack_628 + fStack_5a8;
          fStack_564 = fStack_624 + fStack_5a4;
          do {
            auVar158._8_4_ = 0x7f800000;
            auVar158._0_8_ = 0x7f8000007f800000;
            auVar158._12_4_ = 0x7f800000;
            auVar158._16_4_ = 0x7f800000;
            auVar158._20_4_ = 0x7f800000;
            auVar158._24_4_ = 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar158,_local_640);
            auVar127._0_4_ =
                 (uint)(bVar54 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar54 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar54 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar54 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar91 = vminps_avx(auVar127,auVar91);
            auVar89 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar89);
            auVar89 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar89);
            uVar13 = vcmpps_avx512vl(auVar127,auVar91,0);
            bVar49 = (byte)uVar13 & bVar54;
            bVar58 = bVar54;
            if (bVar49 != 0) {
              bVar58 = bVar49;
            }
            iVar15 = 0;
            for (uVar64 = (uint)bVar58; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar58 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar64 = *(uint *)(local_540 + (uint)(iVar15 << 2));
            fVar235 = *(float *)(local_1c0 + (uint)(iVar15 << 2));
            fVar236 = auVar68._0_4_;
            if ((float)local_780._0_4_ < 0.0) {
              fVar236 = sqrtf((float)local_780._0_4_);
            }
            auVar254 = ZEXT464(uVar64);
            bVar49 = ~bVar58;
            lVar59 = 5;
            do {
              auVar145._4_4_ = fVar235;
              auVar145._0_4_ = fVar235;
              auVar145._8_4_ = fVar235;
              auVar145._12_4_ = fVar235;
              auVar65 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_770);
              fVar253 = auVar254._0_4_;
              fVar240 = 1.0 - fVar253;
              auVar71 = SUB6416(ZEXT464(0x40400000),0);
              auVar244 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar67 = auVar254._0_16_;
              auVar77 = vfmadd213ss_fma(auVar71,auVar67,auVar244);
              auVar69 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar253 * fVar253)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar66 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar240),auVar244);
              auVar66 = vfmadd213ss_fma(auVar66,ZEXT416((uint)(fVar240 * fVar240)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar237 = fVar240 * fVar240 * -fVar253 * 0.5;
              fVar238 = auVar69._0_4_ * 0.5;
              fVar239 = auVar66._0_4_ * 0.5;
              fVar258 = fVar253 * fVar253 * -fVar240 * 0.5;
              auVar205._0_4_ = fVar258 * (float)local_760._0_4_;
              auVar205._4_4_ = fVar258 * (float)local_760._4_4_;
              auVar205._8_4_ = fVar258 * fStack_758;
              auVar205._12_4_ = fVar258 * fStack_754;
              auVar220._4_4_ = fVar239;
              auVar220._0_4_ = fVar239;
              auVar220._8_4_ = fVar239;
              auVar220._12_4_ = fVar239;
              auVar69 = vfmadd132ps_fma(auVar220,auVar205,local_720._0_16_);
              auVar186._4_4_ = fVar238;
              auVar186._0_4_ = fVar238;
              auVar186._8_4_ = fVar238;
              auVar186._12_4_ = fVar238;
              auVar69 = vfmadd132ps_fma(auVar186,auVar69,local_740._0_16_);
              auVar206._4_4_ = fVar237;
              auVar206._0_4_ = fVar237;
              auVar206._8_4_ = fVar237;
              auVar206._12_4_ = fVar237;
              auVar69 = vfmadd132ps_fma(auVar206,auVar69,local_700._0_16_);
              auVar66 = vfmadd231ss_fma(auVar244,auVar67,ZEXT416(0x41100000));
              local_620._0_16_ = auVar66;
              local_650 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar67,ZEXT416(0x40800000)
                                         );
              local_660 = vfmadd213ss_fma(auVar71,auVar67,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar69;
              auVar69 = vsubps_avx(auVar65,auVar69);
              auVar65 = vdpps_avx(auVar69,auVar69,0x7f);
              fVar237 = auVar65._0_4_;
              if (fVar237 < 0.0) {
                auVar251._0_4_ = sqrtf(fVar237);
                auVar251._4_60_ = extraout_var;
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar66 = auVar251._0_16_;
              }
              else {
                auVar66 = vsqrtss_avx(auVar65,auVar65);
              }
              auVar72 = vfnmadd231ss_fma(ZEXT416((uint)(fVar253 * (fVar240 + fVar240))),
                                         ZEXT416((uint)fVar240),ZEXT416((uint)fVar240));
              auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar253 + fVar253)),
                                        ZEXT416((uint)(fVar253 * fVar253 * 3.0)));
              auVar244 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar67,
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar240 * -3.0)),
                                        ZEXT416((uint)(fVar240 + fVar240)),auVar244);
              auVar244 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 * -2.0)),auVar67,
                                         ZEXT416((uint)(fVar253 * fVar253)));
              fVar238 = auVar72._0_4_ * 0.5;
              fVar239 = auVar77._0_4_ * 0.5;
              fVar258 = auVar71._0_4_ * 0.5;
              fVar240 = auVar244._0_4_ * 0.5;
              auVar207._0_4_ = fVar240 * (float)local_760._0_4_;
              auVar207._4_4_ = fVar240 * (float)local_760._4_4_;
              auVar207._8_4_ = fVar240 * fStack_758;
              auVar207._12_4_ = fVar240 * fStack_754;
              auVar187._4_4_ = fVar258;
              auVar187._0_4_ = fVar258;
              auVar187._8_4_ = fVar258;
              auVar187._12_4_ = fVar258;
              auVar77 = vfmadd132ps_fma(auVar187,auVar207,local_720._0_16_);
              auVar166._4_4_ = fVar239;
              auVar166._0_4_ = fVar239;
              auVar166._8_4_ = fVar239;
              auVar166._12_4_ = fVar239;
              auVar77 = vfmadd132ps_fma(auVar166,auVar77,local_740._0_16_);
              auVar266._4_4_ = fVar238;
              auVar266._0_4_ = fVar238;
              auVar266._8_4_ = fVar238;
              auVar266._12_4_ = fVar238;
              auVar244 = vfmadd132ps_fma(auVar266,auVar77,local_700._0_16_);
              auVar77 = vdpps_avx(auVar244,auVar244,0x7f);
              auVar40._12_4_ = 0;
              auVar40._0_12_ = ZEXT812(0);
              fVar238 = auVar77._0_4_;
              auVar71 = vrsqrt14ss_avx512f(auVar40 << 0x20,ZEXT416((uint)fVar238));
              fVar239 = auVar71._0_4_;
              auVar72 = vrcp14ss_avx512f(auVar40 << 0x20,ZEXT416((uint)fVar238));
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar73 = vxorps_avx512vl(auVar77,auVar17);
              auVar71 = vfnmadd213ss_fma(auVar72,auVar77,SUB6416(ZEXT464(0x40000000),0));
              uVar64 = auVar66._0_4_;
              if (fVar238 < auVar73._0_4_) {
                fVar258 = sqrtf(fVar238);
                auVar66 = ZEXT416(uVar64);
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
                fVar258 = auVar77._0_4_;
              }
              fVar239 = fVar239 * 1.5 + fVar238 * -0.5 * fVar239 * fVar239 * fVar239;
              auVar146._0_4_ = auVar244._0_4_ * fVar239;
              auVar146._4_4_ = auVar244._4_4_ * fVar239;
              auVar146._8_4_ = auVar244._8_4_ * fVar239;
              auVar146._12_4_ = auVar244._12_4_ * fVar239;
              auVar77 = vdpps_avx(auVar69,auVar146,0x7f);
              fVar241 = auVar66._0_4_;
              auVar147._0_4_ = auVar77._0_4_ * auVar77._0_4_;
              auVar147._4_4_ = auVar77._4_4_ * auVar77._4_4_;
              auVar147._8_4_ = auVar77._8_4_ * auVar77._8_4_;
              auVar147._12_4_ = auVar77._12_4_ * auVar77._12_4_;
              auVar74 = vsubps_avx512vl(auVar65,auVar147);
              fVar240 = auVar74._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar240;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar75 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              if (fVar240 < 0.0) {
                local_690 = fVar239;
                fStack_68c = fVar239;
                fStack_688 = fVar239;
                fStack_684 = fVar239;
                local_680 = auVar73;
                local_670 = auVar77;
                fVar142 = sqrtf(fVar240);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar66 = ZEXT416(uVar64);
                auVar77 = local_670;
                auVar73 = local_680;
                fVar239 = local_690;
                fVar247 = fStack_68c;
                fVar248 = fStack_688;
                fVar252 = fStack_684;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
                fVar142 = auVar74._0_4_;
                fVar247 = fVar239;
                fVar248 = fVar239;
                fVar252 = fVar239;
              }
              auVar261 = ZEXT1664(auVar69);
              auVar249._8_4_ = 0x7fffffff;
              auVar249._0_8_ = 0x7fffffff7fffffff;
              auVar249._12_4_ = 0x7fffffff;
              auVar251 = ZEXT1664(auVar249);
              auVar168._0_4_ = (float)local_660._0_4_ * (float)local_760._0_4_;
              auVar168._4_4_ = (float)local_660._0_4_ * (float)local_760._4_4_;
              auVar168._8_4_ = (float)local_660._0_4_ * fStack_758;
              auVar168._12_4_ = (float)local_660._0_4_ * fStack_754;
              auVar188._4_4_ = local_650._0_4_;
              auVar188._0_4_ = local_650._0_4_;
              auVar188._8_4_ = local_650._0_4_;
              auVar188._12_4_ = local_650._0_4_;
              auVar74 = vfmadd132ps_fma(auVar188,auVar168,local_720._0_16_);
              auVar169._4_4_ = local_620._0_4_;
              auVar169._0_4_ = local_620._0_4_;
              auVar169._8_4_ = local_620._0_4_;
              auVar169._12_4_ = local_620._0_4_;
              auVar74 = vfmadd132ps_fma(auVar169,auVar74,local_740._0_16_);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar67,ZEXT416(0x40000000));
              auVar189._0_4_ = auVar67._0_4_;
              auVar189._4_4_ = auVar189._0_4_;
              auVar189._8_4_ = auVar189._0_4_;
              auVar189._12_4_ = auVar189._0_4_;
              auVar67 = vfmadd132ps_fma(auVar189,auVar74,local_700._0_16_);
              auVar170._0_4_ = auVar67._0_4_ * fVar238;
              auVar170._4_4_ = auVar67._4_4_ * fVar238;
              auVar170._8_4_ = auVar67._8_4_ * fVar238;
              auVar170._12_4_ = auVar67._12_4_ * fVar238;
              auVar67 = vdpps_avx(auVar244,auVar67,0x7f);
              fVar238 = auVar67._0_4_;
              auVar190._0_4_ = auVar244._0_4_ * fVar238;
              auVar190._4_4_ = auVar244._4_4_ * fVar238;
              auVar190._8_4_ = auVar244._8_4_ * fVar238;
              auVar190._12_4_ = auVar244._12_4_ * fVar238;
              auVar67 = vsubps_avx(auVar170,auVar190);
              local_9f0 = auVar72._0_4_;
              local_9f0 = auVar71._0_4_ * local_9f0;
              auVar72 = vmaxss_avx(ZEXT416((uint)fVar229),
                                   ZEXT416((uint)(fVar235 * fVar236 * 1.9073486e-06)));
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar244,auVar18);
              auVar191._0_4_ = fVar239 * auVar67._0_4_ * local_9f0;
              auVar191._4_4_ = fVar247 * auVar67._4_4_ * local_9f0;
              auVar191._8_4_ = fVar248 * auVar67._8_4_ * local_9f0;
              auVar191._12_4_ = fVar252 * auVar67._12_4_ * local_9f0;
              auVar71 = vdpps_avx(auVar76,auVar146,0x7f);
              auVar67 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar229),auVar72);
              auVar66 = vdpps_avx(auVar69,auVar191,0x7f);
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),
                                        ZEXT416((uint)(fVar229 / fVar258)),auVar67);
              fVar238 = auVar71._0_4_ + auVar66._0_4_;
              auVar66 = vdpps_avx(local_770,auVar146,0x7f);
              auVar71 = vdpps_avx(auVar69,auVar76,0x7f);
              auVar67 = vmulss_avx512f(auVar73,ZEXT416((uint)(fVar240 * -0.5)));
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar67._0_4_ * auVar73._0_4_)));
              auVar67 = vdpps_avx(auVar69,local_770,0x7f);
              auVar73 = vfnmadd231ss_fma(auVar71,auVar77,ZEXT416((uint)fVar238));
              auVar75 = vfnmadd231ss_fma(auVar67,auVar77,auVar66);
              auVar71 = vpermilps_avx(local_600._0_16_,0xff);
              fVar142 = fVar142 - auVar71._0_4_;
              auVar71 = vshufps_avx(auVar244,auVar244,0xff);
              auVar67 = vfmsub213ss_fma(auVar73,auVar76,auVar71);
              fVar239 = auVar75._0_4_ * auVar76._0_4_;
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar67._0_4_)),
                                        ZEXT416((uint)fVar238),ZEXT416((uint)fVar239));
              fVar258 = auVar73._0_4_;
              fVar253 = fVar253 - (auVar77._0_4_ * (fVar239 / fVar258) -
                                  fVar142 * (auVar66._0_4_ / fVar258));
              auVar254 = ZEXT464((uint)fVar253);
              fVar235 = fVar235 - (fVar142 * (fVar238 / fVar258) -
                                  auVar77._0_4_ * (auVar67._0_4_ / fVar258));
              auVar77 = vandps_avx(auVar77,auVar249);
              bVar60 = true;
              if (auVar77._0_4_ < auVar74._0_4_) {
                auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ + auVar72._0_4_)),local_6b0,
                                          ZEXT416(0x36000000));
                auVar77 = vandps_avx(auVar249,ZEXT416((uint)fVar142));
                if (auVar77._0_4_ < auVar66._0_4_) {
                  fVar235 = fVar235 + (float)local_6a0._0_4_;
                  if ((((fVar163 <= fVar235) &&
                       (fVar238 = *(float *)(ray + k * 4 + 0x100), fVar235 <= fVar238)) &&
                      (0.0 <= fVar253)) && (fVar253 <= 1.0)) {
                    auVar129._0_16_ = ZEXT816(0) << 0x20;
                    auVar128._4_28_ = auVar129._4_28_;
                    auVar128._0_4_ = fVar237;
                    auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar128._0_16_);
                    fVar237 = auVar77._0_4_;
                    auVar65 = vmulss_avx512f(auVar65,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar56].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar58 = true;
                      }
                      else {
                        fVar237 = fVar237 * 1.5 + auVar65._0_4_ * fVar237 * fVar237 * fVar237;
                        auVar171._0_4_ = auVar69._0_4_ * fVar237;
                        auVar171._4_4_ = auVar69._4_4_ * fVar237;
                        auVar171._8_4_ = auVar69._8_4_ * fVar237;
                        auVar171._12_4_ = auVar69._12_4_ * fVar237;
                        auVar71 = vfmadd213ps_fma(auVar71,auVar171,auVar244);
                        auVar65 = vshufps_avx(auVar171,auVar171,0xc9);
                        auVar77 = vshufps_avx(auVar244,auVar244,0xc9);
                        auVar172._0_4_ = auVar171._0_4_ * auVar77._0_4_;
                        auVar172._4_4_ = auVar171._4_4_ * auVar77._4_4_;
                        auVar172._8_4_ = auVar171._8_4_ * auVar77._8_4_;
                        auVar172._12_4_ = auVar171._12_4_ * auVar77._12_4_;
                        auVar66 = vfmsub231ps_fma(auVar172,auVar244,auVar65);
                        auVar65 = vshufps_avx(auVar66,auVar66,0xc9);
                        auVar77 = vshufps_avx(auVar71,auVar71,0xc9);
                        auVar66 = vshufps_avx(auVar66,auVar66,0xd2);
                        auVar148._0_4_ = auVar71._0_4_ * auVar66._0_4_;
                        auVar148._4_4_ = auVar71._4_4_ * auVar66._4_4_;
                        auVar148._8_4_ = auVar71._8_4_ * auVar66._8_4_;
                        auVar148._12_4_ = auVar71._12_4_ * auVar66._12_4_;
                        auVar65 = vfmsub231ps_fma(auVar148,auVar65,auVar77);
                        auVar198._8_4_ = 1;
                        auVar198._0_8_ = 0x100000001;
                        auVar198._12_4_ = 1;
                        auVar198._16_4_ = 1;
                        auVar198._20_4_ = 1;
                        auVar198._24_4_ = 1;
                        auVar198._28_4_ = 1;
                        auVar91 = vpermps_avx2(auVar198,ZEXT1632(auVar65));
                        auVar214._8_4_ = 2;
                        auVar214._0_8_ = 0x200000002;
                        auVar214._12_4_ = 2;
                        auVar214._16_4_ = 2;
                        auVar214._20_4_ = 2;
                        auVar214._24_4_ = 2;
                        auVar214._28_4_ = 2;
                        local_420 = vpermps_avx2(auVar214,ZEXT1632(auVar65));
                        local_400 = auVar65._0_4_;
                        local_440[0] = (RTCHitN)auVar91[0];
                        local_440[1] = (RTCHitN)auVar91[1];
                        local_440[2] = (RTCHitN)auVar91[2];
                        local_440[3] = (RTCHitN)auVar91[3];
                        local_440[4] = (RTCHitN)auVar91[4];
                        local_440[5] = (RTCHitN)auVar91[5];
                        local_440[6] = (RTCHitN)auVar91[6];
                        local_440[7] = (RTCHitN)auVar91[7];
                        local_440[8] = (RTCHitN)auVar91[8];
                        local_440[9] = (RTCHitN)auVar91[9];
                        local_440[10] = (RTCHitN)auVar91[10];
                        local_440[0xb] = (RTCHitN)auVar91[0xb];
                        local_440[0xc] = (RTCHitN)auVar91[0xc];
                        local_440[0xd] = (RTCHitN)auVar91[0xd];
                        local_440[0xe] = (RTCHitN)auVar91[0xe];
                        local_440[0xf] = (RTCHitN)auVar91[0xf];
                        local_440[0x10] = (RTCHitN)auVar91[0x10];
                        local_440[0x11] = (RTCHitN)auVar91[0x11];
                        local_440[0x12] = (RTCHitN)auVar91[0x12];
                        local_440[0x13] = (RTCHitN)auVar91[0x13];
                        local_440[0x14] = (RTCHitN)auVar91[0x14];
                        local_440[0x15] = (RTCHitN)auVar91[0x15];
                        local_440[0x16] = (RTCHitN)auVar91[0x16];
                        local_440[0x17] = (RTCHitN)auVar91[0x17];
                        local_440[0x18] = (RTCHitN)auVar91[0x18];
                        local_440[0x19] = (RTCHitN)auVar91[0x19];
                        local_440[0x1a] = (RTCHitN)auVar91[0x1a];
                        local_440[0x1b] = (RTCHitN)auVar91[0x1b];
                        local_440[0x1c] = (RTCHitN)auVar91[0x1c];
                        local_440[0x1d] = (RTCHitN)auVar91[0x1d];
                        local_440[0x1e] = (RTCHitN)auVar91[0x1e];
                        local_440[0x1f] = (RTCHitN)auVar91[0x1f];
                        uStack_3fc = local_400;
                        uStack_3f8 = local_400;
                        uStack_3f4 = local_400;
                        uStack_3f0 = local_400;
                        uStack_3ec = local_400;
                        uStack_3e8 = local_400;
                        uStack_3e4 = local_400;
                        local_3e0 = fVar253;
                        fStack_3dc = fVar253;
                        fStack_3d8 = fVar253;
                        fStack_3d4 = fVar253;
                        fStack_3d0 = fVar253;
                        fStack_3cc = fVar253;
                        fStack_3c8 = fVar253;
                        fStack_3c4 = fVar253;
                        local_3c0 = ZEXT432(0) << 0x20;
                        local_3a0 = local_4c0._0_8_;
                        uStack_398 = local_4c0._8_8_;
                        uStack_390 = local_4c0._16_8_;
                        uStack_388 = local_4c0._24_8_;
                        local_380 = local_4e0;
                        vpcmpeqd_avx2(local_4e0,local_4e0);
                        local_360 = context->user->instID[0];
                        uStack_35c = local_360;
                        uStack_358 = local_360;
                        uStack_354 = local_360;
                        uStack_350 = local_360;
                        uStack_34c = local_360;
                        uStack_348 = local_360;
                        uStack_344 = local_360;
                        local_340 = context->user->instPrimID[0];
                        uStack_33c = local_340;
                        uStack_338 = local_340;
                        uStack_334 = local_340;
                        uStack_330 = local_340;
                        uStack_32c = local_340;
                        uStack_328 = local_340;
                        uStack_324 = local_340;
                        *(float *)(ray + k * 4 + 0x100) = fVar235;
                        local_6e0 = local_500._0_8_;
                        uStack_6d8 = local_500._8_8_;
                        uStack_6d0 = local_500._16_8_;
                        uStack_6c8 = local_500._24_8_;
                        local_7d0.valid = (int *)&local_6e0;
                        local_7d0.geometryUserPtr = pGVar3->userPtr;
                        local_7d0.context = context->user;
                        local_7d0.hit = local_440;
                        local_7d0.N = 8;
                        local_7d0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar261 = ZEXT1664(auVar69);
                          (*pGVar3->occlusionFilterN)(&local_7d0);
                          auVar254 = ZEXT1664(ZEXT416((uint)fVar253));
                          auVar251 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar42._8_8_ = uStack_6d8;
                        auVar42._0_8_ = local_6e0;
                        auVar42._16_8_ = uStack_6d0;
                        auVar42._24_8_ = uStack_6c8;
                        if (auVar42 == (undefined1  [32])0x0) {
                          bVar58 = false;
                        }
                        else {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            (*p_Var4)(&local_7d0);
                            auVar254 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar251 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar43._8_8_ = uStack_6d8;
                          auVar43._0_8_ = local_6e0;
                          auVar43._16_8_ = uStack_6d0;
                          auVar43._24_8_ = uStack_6c8;
                          uVar63 = vptestmd_avx512vl(auVar43,auVar43);
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar60 = (bool)((byte)uVar63 & 1);
                          bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
                          bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
                          bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
                          bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
                          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                          bVar11 = SUB81(uVar63 >> 7,0);
                          *(uint *)(local_7d0.ray + 0x100) =
                               (uint)bVar60 * auVar91._0_4_ |
                               (uint)!bVar60 * *(int *)(local_7d0.ray + 0x100);
                          *(uint *)(local_7d0.ray + 0x104) =
                               (uint)bVar5 * auVar91._4_4_ |
                               (uint)!bVar5 * *(int *)(local_7d0.ray + 0x104);
                          *(uint *)(local_7d0.ray + 0x108) =
                               (uint)bVar6 * auVar91._8_4_ |
                               (uint)!bVar6 * *(int *)(local_7d0.ray + 0x108);
                          *(uint *)(local_7d0.ray + 0x10c) =
                               (uint)bVar7 * auVar91._12_4_ |
                               (uint)!bVar7 * *(int *)(local_7d0.ray + 0x10c);
                          *(uint *)(local_7d0.ray + 0x110) =
                               (uint)bVar8 * auVar91._16_4_ |
                               (uint)!bVar8 * *(int *)(local_7d0.ray + 0x110);
                          *(uint *)(local_7d0.ray + 0x114) =
                               (uint)bVar9 * auVar91._20_4_ |
                               (uint)!bVar9 * *(int *)(local_7d0.ray + 0x114);
                          *(uint *)(local_7d0.ray + 0x118) =
                               (uint)bVar10 * auVar91._24_4_ |
                               (uint)!bVar10 * *(int *)(local_7d0.ray + 0x118);
                          *(uint *)(local_7d0.ray + 0x11c) =
                               (uint)bVar11 * auVar91._28_4_ |
                               (uint)!bVar11 * *(int *)(local_7d0.ray + 0x11c);
                          bVar58 = auVar43 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar58 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar238;
                        }
                      }
                      bVar60 = false;
                      goto LAB_01b56bc3;
                    }
                  }
                  bVar60 = false;
                  bVar58 = 0;
                }
              }
LAB_01b56bc3:
              if (!bVar60) goto LAB_01b56f94;
              lVar59 = lVar59 + -1;
            } while (lVar59 != 0);
            bVar58 = 0;
LAB_01b56f94:
            bVar57 = bVar57 | bVar58 & 1;
            auVar46._4_4_ = fStack_57c;
            auVar46._0_4_ = local_580;
            auVar46._8_4_ = fStack_578;
            auVar46._12_4_ = fStack_574;
            auVar46._16_4_ = fStack_570;
            auVar46._20_4_ = fStack_56c;
            auVar46._24_4_ = fStack_568;
            auVar46._28_4_ = fStack_564;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            uVar13 = vcmpps_avx512vl(auVar46,auVar28,2);
            bVar54 = bVar49 & bVar54 & (byte)uVar13;
          } while (bVar54 != 0);
        }
        auVar159._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
        auVar159._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
        auVar159._8_4_ = fStack_5b8 + fStack_598;
        auVar159._12_4_ = fStack_5b4 + fStack_594;
        auVar159._16_4_ = fStack_5b0 + fStack_590;
        auVar159._20_4_ = fStack_5ac + fStack_58c;
        auVar159._24_4_ = fStack_5a8 + fStack_588;
        auVar159._28_4_ = fStack_5a4 + fStack_584;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar29._4_4_ = uVar1;
        auVar29._0_4_ = uVar1;
        auVar29._8_4_ = uVar1;
        auVar29._12_4_ = uVar1;
        auVar29._16_4_ = uVar1;
        auVar29._20_4_ = uVar1;
        auVar29._24_4_ = uVar1;
        auVar29._28_4_ = uVar1;
        uVar13 = vcmpps_avx512vl(auVar159,auVar29,2);
        bVar55 = (byte)uVar12 | ~bVar55;
        bVar52 = (byte)uVar14 & bVar52 & (byte)uVar13;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar91 = vpblendmd_avx512vl(auVar160,auVar30);
        local_5a0._0_4_ = (uint)(bVar55 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar60 = (bool)(bVar55 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar55 >> 2 & 1);
        fStack_598 = (float)((uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar55 >> 3 & 1);
        fStack_594 = (float)((uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar55 >> 4 & 1);
        fStack_590 = (float)((uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar55 >> 5 & 1);
        fStack_58c = (float)((uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * 2);
        bVar60 = (bool)(bVar55 >> 6 & 1);
        fStack_588 = (float)((uint)bVar60 * auVar91._24_4_ | (uint)!bVar60 * 2);
        fStack_584 = (float)((uint)(bVar55 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2);
        uVar12 = vpcmpd_avx512vl(_local_5a0,local_4a0,2);
        bVar55 = (byte)uVar12 & bVar52;
        if (bVar55 == 0) {
          auVar269 = ZEXT3264(local_7a0);
        }
        else {
          auVar69 = vminps_avx(local_700._0_16_,local_740._0_16_);
          auVar65 = vmaxps_avx(local_700._0_16_,local_740._0_16_);
          auVar77 = vminps_avx(local_720._0_16_,local_760._0_16_);
          auVar66 = vminps_avx(auVar69,auVar77);
          auVar69 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
          auVar77 = vmaxps_avx(auVar65,auVar69);
          auVar65 = vandps_avx(auVar251._0_16_,auVar66);
          auVar69 = vandps_avx(auVar251._0_16_,auVar77);
          auVar65 = vmaxps_avx(auVar65,auVar69);
          auVar69 = vmovshdup_avx(auVar65);
          auVar69 = vmaxss_avx(auVar69,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar69);
          fVar229 = auVar65._0_4_ * 1.9073486e-06;
          local_6b0 = vshufps_avx(auVar77,auVar77,0xff);
          _local_640 = _local_320;
          local_580 = (float)local_5c0._0_4_ + (float)local_320._0_4_;
          fStack_57c = (float)local_5c0._4_4_ + (float)local_320._4_4_;
          fStack_578 = fStack_5b8 + fStack_318;
          fStack_574 = fStack_5b4 + fStack_314;
          fStack_570 = fStack_5b0 + fStack_310;
          fStack_56c = fStack_5ac + fStack_30c;
          fStack_568 = fStack_5a8 + fStack_308;
          fStack_564 = fStack_5a4 + fStack_304;
          do {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar161,_local_640);
            auVar130._0_4_ =
                 (uint)(bVar55 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar130._24_4_ =
                 (uint)(bVar55 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar55 >> 6) * 0x7f800000;
            auVar130._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar91 = vminps_avx(auVar130,auVar91);
            auVar89 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar89);
            auVar89 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar89);
            uVar12 = vcmpps_avx512vl(auVar130,auVar91,0);
            bVar58 = (byte)uVar12 & bVar55;
            bVar54 = bVar55;
            if (bVar58 != 0) {
              bVar54 = bVar58;
            }
            iVar15 = 0;
            for (uVar64 = (uint)bVar54; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar54 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar64 = *(uint *)(local_560 + (uint)(iVar15 << 2));
            fVar235 = *(float *)(local_300 + (uint)(iVar15 << 2));
            fVar236 = auVar70._0_4_;
            if ((float)local_780._0_4_ < 0.0) {
              fVar236 = sqrtf((float)local_780._0_4_);
            }
            auVar254 = ZEXT464(uVar64);
            bVar58 = ~bVar54;
            lVar59 = 5;
            do {
              auVar149._4_4_ = fVar235;
              auVar149._0_4_ = fVar235;
              auVar149._8_4_ = fVar235;
              auVar149._12_4_ = fVar235;
              auVar65 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_770);
              fVar253 = auVar254._0_4_;
              fVar240 = 1.0 - fVar253;
              auVar71 = SUB6416(ZEXT464(0x40400000),0);
              auVar244 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar67 = auVar254._0_16_;
              auVar77 = vfmadd213ss_fma(auVar71,auVar67,auVar244);
              auVar69 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar253 * fVar253)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar66 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar240),auVar244);
              auVar66 = vfmadd213ss_fma(auVar66,ZEXT416((uint)(fVar240 * fVar240)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar237 = fVar240 * fVar240 * -fVar253 * 0.5;
              fVar238 = auVar69._0_4_ * 0.5;
              fVar239 = auVar66._0_4_ * 0.5;
              fVar258 = fVar253 * fVar253 * -fVar240 * 0.5;
              auVar208._0_4_ = fVar258 * (float)local_760._0_4_;
              auVar208._4_4_ = fVar258 * (float)local_760._4_4_;
              auVar208._8_4_ = fVar258 * fStack_758;
              auVar208._12_4_ = fVar258 * fStack_754;
              auVar221._4_4_ = fVar239;
              auVar221._0_4_ = fVar239;
              auVar221._8_4_ = fVar239;
              auVar221._12_4_ = fVar239;
              auVar69 = vfmadd132ps_fma(auVar221,auVar208,local_720._0_16_);
              auVar192._4_4_ = fVar238;
              auVar192._0_4_ = fVar238;
              auVar192._8_4_ = fVar238;
              auVar192._12_4_ = fVar238;
              auVar69 = vfmadd132ps_fma(auVar192,auVar69,local_740._0_16_);
              auVar209._4_4_ = fVar237;
              auVar209._0_4_ = fVar237;
              auVar209._8_4_ = fVar237;
              auVar209._12_4_ = fVar237;
              auVar69 = vfmadd132ps_fma(auVar209,auVar69,local_700._0_16_);
              auVar66 = vfmadd231ss_fma(auVar244,auVar67,ZEXT416(0x41100000));
              local_620._0_16_ = auVar66;
              local_650 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar67,ZEXT416(0x40800000)
                                         );
              local_660 = vfmadd213ss_fma(auVar71,auVar67,ZEXT416(0xbf800000));
              local_600._0_16_ = auVar69;
              auVar69 = vsubps_avx(auVar65,auVar69);
              auVar65 = vdpps_avx(auVar69,auVar69,0x7f);
              fVar237 = auVar65._0_4_;
              if (fVar237 < 0.0) {
                auVar254._0_4_ = sqrtf(fVar237);
                auVar254._4_60_ = extraout_var_00;
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar66 = auVar254._0_16_;
              }
              else {
                auVar66 = vsqrtss_avx(auVar65,auVar65);
              }
              auVar72 = vfnmadd231ss_fma(ZEXT416((uint)(fVar253 * (fVar240 + fVar240))),
                                         ZEXT416((uint)fVar240),ZEXT416((uint)fVar240));
              auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar253 + fVar253)),
                                        ZEXT416((uint)(fVar253 * fVar253 * 3.0)));
              auVar244 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar67,
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar240 * -3.0)),
                                        ZEXT416((uint)(fVar240 + fVar240)),auVar244);
              auVar244 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 * -2.0)),auVar67,
                                         ZEXT416((uint)(fVar253 * fVar253)));
              fVar238 = auVar72._0_4_ * 0.5;
              fVar239 = auVar77._0_4_ * 0.5;
              fVar258 = auVar71._0_4_ * 0.5;
              fVar240 = auVar244._0_4_ * 0.5;
              auVar210._0_4_ = fVar240 * (float)local_760._0_4_;
              auVar210._4_4_ = fVar240 * (float)local_760._4_4_;
              auVar210._8_4_ = fVar240 * fStack_758;
              auVar210._12_4_ = fVar240 * fStack_754;
              auVar193._4_4_ = fVar258;
              auVar193._0_4_ = fVar258;
              auVar193._8_4_ = fVar258;
              auVar193._12_4_ = fVar258;
              auVar77 = vfmadd132ps_fma(auVar193,auVar210,local_720._0_16_);
              auVar173._4_4_ = fVar239;
              auVar173._0_4_ = fVar239;
              auVar173._8_4_ = fVar239;
              auVar173._12_4_ = fVar239;
              auVar77 = vfmadd132ps_fma(auVar173,auVar77,local_740._0_16_);
              auVar267._4_4_ = fVar238;
              auVar267._0_4_ = fVar238;
              auVar267._8_4_ = fVar238;
              auVar267._12_4_ = fVar238;
              auVar244 = vfmadd132ps_fma(auVar267,auVar77,local_700._0_16_);
              auVar77 = vdpps_avx(auVar244,auVar244,0x7f);
              auVar41._12_4_ = 0;
              auVar41._0_12_ = ZEXT812(0);
              fVar238 = auVar77._0_4_;
              auVar71 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar238));
              fVar239 = auVar71._0_4_;
              auVar72 = vrcp14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar238));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar73 = vxorps_avx512vl(auVar77,auVar19);
              auVar71 = vfnmadd213ss_fma(auVar72,auVar77,SUB6416(ZEXT464(0x40000000),0));
              uVar64 = auVar66._0_4_;
              if (fVar238 < auVar73._0_4_) {
                fVar258 = sqrtf(fVar238);
                auVar66 = ZEXT416(uVar64);
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
                fVar258 = auVar77._0_4_;
              }
              fVar239 = fVar239 * 1.5 + fVar238 * -0.5 * fVar239 * fVar239 * fVar239;
              auVar150._0_4_ = auVar244._0_4_ * fVar239;
              auVar150._4_4_ = auVar244._4_4_ * fVar239;
              auVar150._8_4_ = auVar244._8_4_ * fVar239;
              auVar150._12_4_ = auVar244._12_4_ * fVar239;
              auVar77 = vdpps_avx(auVar69,auVar150,0x7f);
              fVar241 = auVar66._0_4_;
              auVar151._0_4_ = auVar77._0_4_ * auVar77._0_4_;
              auVar151._4_4_ = auVar77._4_4_ * auVar77._4_4_;
              auVar151._8_4_ = auVar77._8_4_ * auVar77._8_4_;
              auVar151._12_4_ = auVar77._12_4_ * auVar77._12_4_;
              auVar74 = vsubps_avx512vl(auVar65,auVar151);
              fVar240 = auVar74._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar240;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar75 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              if (fVar240 < 0.0) {
                local_690 = fVar239;
                fStack_68c = fVar239;
                fStack_688 = fVar239;
                fStack_684 = fVar239;
                local_680 = auVar73;
                local_670 = auVar77;
                fVar142 = sqrtf(fVar240);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar66 = ZEXT416(uVar64);
                auVar77 = local_670;
                auVar73 = local_680;
                fVar239 = local_690;
                fVar247 = fStack_68c;
                fVar248 = fStack_688;
                fVar252 = fStack_684;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
                fVar142 = auVar74._0_4_;
                fVar247 = fVar239;
                fVar248 = fVar239;
                fVar252 = fVar239;
              }
              auVar261 = ZEXT1664(auVar69);
              auVar250._8_4_ = 0x7fffffff;
              auVar250._0_8_ = 0x7fffffff7fffffff;
              auVar250._12_4_ = 0x7fffffff;
              auVar251 = ZEXT1664(auVar250);
              auVar269 = ZEXT3264(local_7a0);
              auVar175._0_4_ = (float)local_660._0_4_ * (float)local_760._0_4_;
              auVar175._4_4_ = (float)local_660._0_4_ * (float)local_760._4_4_;
              auVar175._8_4_ = (float)local_660._0_4_ * fStack_758;
              auVar175._12_4_ = (float)local_660._0_4_ * fStack_754;
              auVar194._4_4_ = local_650._0_4_;
              auVar194._0_4_ = local_650._0_4_;
              auVar194._8_4_ = local_650._0_4_;
              auVar194._12_4_ = local_650._0_4_;
              auVar74 = vfmadd132ps_fma(auVar194,auVar175,local_720._0_16_);
              auVar176._4_4_ = local_620._0_4_;
              auVar176._0_4_ = local_620._0_4_;
              auVar176._8_4_ = local_620._0_4_;
              auVar176._12_4_ = local_620._0_4_;
              auVar74 = vfmadd132ps_fma(auVar176,auVar74,local_740._0_16_);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar67,ZEXT416(0x40000000));
              auVar195._0_4_ = auVar67._0_4_;
              auVar195._4_4_ = auVar195._0_4_;
              auVar195._8_4_ = auVar195._0_4_;
              auVar195._12_4_ = auVar195._0_4_;
              auVar67 = vfmadd132ps_fma(auVar195,auVar74,local_700._0_16_);
              auVar177._0_4_ = auVar67._0_4_ * fVar238;
              auVar177._4_4_ = auVar67._4_4_ * fVar238;
              auVar177._8_4_ = auVar67._8_4_ * fVar238;
              auVar177._12_4_ = auVar67._12_4_ * fVar238;
              auVar67 = vdpps_avx(auVar244,auVar67,0x7f);
              fVar238 = auVar67._0_4_;
              auVar196._0_4_ = auVar244._0_4_ * fVar238;
              auVar196._4_4_ = auVar244._4_4_ * fVar238;
              auVar196._8_4_ = auVar244._8_4_ * fVar238;
              auVar196._12_4_ = auVar244._12_4_ * fVar238;
              auVar67 = vsubps_avx(auVar177,auVar196);
              local_9f0 = auVar72._0_4_;
              local_9f0 = auVar71._0_4_ * local_9f0;
              auVar72 = vmaxss_avx(ZEXT416((uint)fVar229),
                                   ZEXT416((uint)(fVar235 * fVar236 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar244,auVar20);
              auVar197._0_4_ = fVar239 * auVar67._0_4_ * local_9f0;
              auVar197._4_4_ = fVar247 * auVar67._4_4_ * local_9f0;
              auVar197._8_4_ = fVar248 * auVar67._8_4_ * local_9f0;
              auVar197._12_4_ = fVar252 * auVar67._12_4_ * local_9f0;
              auVar71 = vdpps_avx(auVar76,auVar150,0x7f);
              auVar67 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar229),auVar72);
              auVar66 = vdpps_avx(auVar69,auVar197,0x7f);
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),
                                        ZEXT416((uint)(fVar229 / fVar258)),auVar67);
              fVar238 = auVar71._0_4_ + auVar66._0_4_;
              auVar66 = vdpps_avx(local_770,auVar150,0x7f);
              auVar71 = vdpps_avx(auVar69,auVar76,0x7f);
              auVar67 = vmulss_avx512f(auVar73,ZEXT416((uint)(fVar240 * -0.5)));
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar67._0_4_ * auVar73._0_4_)));
              auVar67 = vdpps_avx(auVar69,local_770,0x7f);
              auVar73 = vfnmadd231ss_fma(auVar71,auVar77,ZEXT416((uint)fVar238));
              auVar75 = vfnmadd231ss_fma(auVar67,auVar77,auVar66);
              auVar71 = vpermilps_avx(local_600._0_16_,0xff);
              fVar142 = fVar142 - auVar71._0_4_;
              auVar71 = vshufps_avx(auVar244,auVar244,0xff);
              auVar67 = vfmsub213ss_fma(auVar73,auVar76,auVar71);
              fVar239 = auVar75._0_4_ * auVar76._0_4_;
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar67._0_4_)),
                                        ZEXT416((uint)fVar238),ZEXT416((uint)fVar239));
              fVar258 = auVar73._0_4_;
              fVar253 = fVar253 - (auVar77._0_4_ * (fVar239 / fVar258) -
                                  fVar142 * (auVar66._0_4_ / fVar258));
              auVar254 = ZEXT464((uint)fVar253);
              fVar235 = fVar235 - (fVar142 * (fVar238 / fVar258) -
                                  auVar77._0_4_ * (auVar67._0_4_ / fVar258));
              auVar77 = vandps_avx(auVar77,auVar250);
              bVar60 = true;
              if (auVar77._0_4_ < auVar74._0_4_) {
                auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ + auVar72._0_4_)),local_6b0,
                                          ZEXT416(0x36000000));
                auVar77 = vandps_avx(auVar250,ZEXT416((uint)fVar142));
                if (auVar77._0_4_ < auVar66._0_4_) {
                  fVar235 = fVar235 + (float)local_6a0._0_4_;
                  if ((((fVar163 <= fVar235) &&
                       (fVar238 = *(float *)(ray + k * 4 + 0x100), fVar235 <= fVar238)) &&
                      (0.0 <= fVar253)) && (fVar253 <= 1.0)) {
                    auVar132._16_16_ = auVar129._16_16_;
                    auVar132._0_16_ = ZEXT816(0) << 0x20;
                    auVar131._4_28_ = auVar132._4_28_;
                    auVar131._0_4_ = fVar237;
                    auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar131._0_16_);
                    fVar237 = auVar77._0_4_;
                    auVar65 = vmulss_avx512f(auVar65,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar56].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar54 = true;
                      }
                      else {
                        fVar237 = fVar237 * 1.5 + auVar65._0_4_ * fVar237 * fVar237 * fVar237;
                        auVar178._0_4_ = auVar69._0_4_ * fVar237;
                        auVar178._4_4_ = auVar69._4_4_ * fVar237;
                        auVar178._8_4_ = auVar69._8_4_ * fVar237;
                        auVar178._12_4_ = auVar69._12_4_ * fVar237;
                        auVar71 = vfmadd213ps_fma(auVar71,auVar178,auVar244);
                        auVar65 = vshufps_avx(auVar178,auVar178,0xc9);
                        auVar77 = vshufps_avx(auVar244,auVar244,0xc9);
                        auVar179._0_4_ = auVar178._0_4_ * auVar77._0_4_;
                        auVar179._4_4_ = auVar178._4_4_ * auVar77._4_4_;
                        auVar179._8_4_ = auVar178._8_4_ * auVar77._8_4_;
                        auVar179._12_4_ = auVar178._12_4_ * auVar77._12_4_;
                        auVar66 = vfmsub231ps_fma(auVar179,auVar244,auVar65);
                        auVar65 = vshufps_avx(auVar66,auVar66,0xc9);
                        auVar77 = vshufps_avx(auVar71,auVar71,0xc9);
                        auVar66 = vshufps_avx(auVar66,auVar66,0xd2);
                        auVar152._0_4_ = auVar71._0_4_ * auVar66._0_4_;
                        auVar152._4_4_ = auVar71._4_4_ * auVar66._4_4_;
                        auVar152._8_4_ = auVar71._8_4_ * auVar66._8_4_;
                        auVar152._12_4_ = auVar71._12_4_ * auVar66._12_4_;
                        auVar65 = vfmsub231ps_fma(auVar152,auVar65,auVar77);
                        auVar199._8_4_ = 1;
                        auVar199._0_8_ = 0x100000001;
                        auVar199._12_4_ = 1;
                        auVar199._16_4_ = 1;
                        auVar199._20_4_ = 1;
                        auVar199._24_4_ = 1;
                        auVar199._28_4_ = 1;
                        auVar91 = vpermps_avx2(auVar199,ZEXT1632(auVar65));
                        auVar215._8_4_ = 2;
                        auVar215._0_8_ = 0x200000002;
                        auVar215._12_4_ = 2;
                        auVar215._16_4_ = 2;
                        auVar215._20_4_ = 2;
                        auVar215._24_4_ = 2;
                        auVar215._28_4_ = 2;
                        local_420 = vpermps_avx2(auVar215,ZEXT1632(auVar65));
                        local_400 = auVar65._0_4_;
                        local_440[0] = (RTCHitN)auVar91[0];
                        local_440[1] = (RTCHitN)auVar91[1];
                        local_440[2] = (RTCHitN)auVar91[2];
                        local_440[3] = (RTCHitN)auVar91[3];
                        local_440[4] = (RTCHitN)auVar91[4];
                        local_440[5] = (RTCHitN)auVar91[5];
                        local_440[6] = (RTCHitN)auVar91[6];
                        local_440[7] = (RTCHitN)auVar91[7];
                        local_440[8] = (RTCHitN)auVar91[8];
                        local_440[9] = (RTCHitN)auVar91[9];
                        local_440[10] = (RTCHitN)auVar91[10];
                        local_440[0xb] = (RTCHitN)auVar91[0xb];
                        local_440[0xc] = (RTCHitN)auVar91[0xc];
                        local_440[0xd] = (RTCHitN)auVar91[0xd];
                        local_440[0xe] = (RTCHitN)auVar91[0xe];
                        local_440[0xf] = (RTCHitN)auVar91[0xf];
                        local_440[0x10] = (RTCHitN)auVar91[0x10];
                        local_440[0x11] = (RTCHitN)auVar91[0x11];
                        local_440[0x12] = (RTCHitN)auVar91[0x12];
                        local_440[0x13] = (RTCHitN)auVar91[0x13];
                        local_440[0x14] = (RTCHitN)auVar91[0x14];
                        local_440[0x15] = (RTCHitN)auVar91[0x15];
                        local_440[0x16] = (RTCHitN)auVar91[0x16];
                        local_440[0x17] = (RTCHitN)auVar91[0x17];
                        local_440[0x18] = (RTCHitN)auVar91[0x18];
                        local_440[0x19] = (RTCHitN)auVar91[0x19];
                        local_440[0x1a] = (RTCHitN)auVar91[0x1a];
                        local_440[0x1b] = (RTCHitN)auVar91[0x1b];
                        local_440[0x1c] = (RTCHitN)auVar91[0x1c];
                        local_440[0x1d] = (RTCHitN)auVar91[0x1d];
                        local_440[0x1e] = (RTCHitN)auVar91[0x1e];
                        local_440[0x1f] = (RTCHitN)auVar91[0x1f];
                        uStack_3fc = local_400;
                        uStack_3f8 = local_400;
                        uStack_3f4 = local_400;
                        uStack_3f0 = local_400;
                        uStack_3ec = local_400;
                        uStack_3e8 = local_400;
                        uStack_3e4 = local_400;
                        local_3e0 = fVar253;
                        fStack_3dc = fVar253;
                        fStack_3d8 = fVar253;
                        fStack_3d4 = fVar253;
                        fStack_3d0 = fVar253;
                        fStack_3cc = fVar253;
                        fStack_3c8 = fVar253;
                        fStack_3c4 = fVar253;
                        local_3c0 = ZEXT432(0) << 0x20;
                        local_3a0 = local_4c0._0_8_;
                        uStack_398 = local_4c0._8_8_;
                        uStack_390 = local_4c0._16_8_;
                        uStack_388 = local_4c0._24_8_;
                        local_380 = local_4e0;
                        vpcmpeqd_avx2(local_4e0,local_4e0);
                        local_360 = context->user->instID[0];
                        uStack_35c = local_360;
                        uStack_358 = local_360;
                        uStack_354 = local_360;
                        uStack_350 = local_360;
                        uStack_34c = local_360;
                        uStack_348 = local_360;
                        uStack_344 = local_360;
                        local_340 = context->user->instPrimID[0];
                        uStack_33c = local_340;
                        uStack_338 = local_340;
                        uStack_334 = local_340;
                        uStack_330 = local_340;
                        uStack_32c = local_340;
                        uStack_328 = local_340;
                        uStack_324 = local_340;
                        *(float *)(ray + k * 4 + 0x100) = fVar235;
                        local_6e0 = local_500._0_8_;
                        uStack_6d8 = local_500._8_8_;
                        uStack_6d0 = local_500._16_8_;
                        uStack_6c8 = local_500._24_8_;
                        local_7d0.valid = (int *)&local_6e0;
                        local_7d0.geometryUserPtr = pGVar3->userPtr;
                        local_7d0.context = context->user;
                        local_7d0.hit = local_440;
                        local_7d0.N = 8;
                        local_7d0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar251 = ZEXT1664(auVar250);
                          auVar261 = ZEXT1664(auVar69);
                          (*pGVar3->occlusionFilterN)(&local_7d0);
                          auVar254 = ZEXT1664(ZEXT416((uint)fVar253));
                          auVar269 = ZEXT3264(local_7a0);
                        }
                        auVar44._8_8_ = uStack_6d8;
                        auVar44._0_8_ = local_6e0;
                        auVar44._16_8_ = uStack_6d0;
                        auVar44._24_8_ = uStack_6c8;
                        if (auVar44 == (undefined1  [32])0x0) {
                          bVar54 = false;
                        }
                        else {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            (*p_Var4)(&local_7d0);
                            auVar254 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar269 = ZEXT3264(local_7a0);
                          }
                          auVar45._8_8_ = uStack_6d8;
                          auVar45._0_8_ = local_6e0;
                          auVar45._16_8_ = uStack_6d0;
                          auVar45._24_8_ = uStack_6c8;
                          uVar63 = vptestmd_avx512vl(auVar45,auVar45);
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar60 = (bool)((byte)uVar63 & 1);
                          bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
                          bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
                          bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
                          bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
                          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                          bVar11 = SUB81(uVar63 >> 7,0);
                          *(uint *)(local_7d0.ray + 0x100) =
                               (uint)bVar60 * auVar91._0_4_ |
                               (uint)!bVar60 * *(int *)(local_7d0.ray + 0x100);
                          *(uint *)(local_7d0.ray + 0x104) =
                               (uint)bVar5 * auVar91._4_4_ |
                               (uint)!bVar5 * *(int *)(local_7d0.ray + 0x104);
                          *(uint *)(local_7d0.ray + 0x108) =
                               (uint)bVar6 * auVar91._8_4_ |
                               (uint)!bVar6 * *(int *)(local_7d0.ray + 0x108);
                          *(uint *)(local_7d0.ray + 0x10c) =
                               (uint)bVar7 * auVar91._12_4_ |
                               (uint)!bVar7 * *(int *)(local_7d0.ray + 0x10c);
                          *(uint *)(local_7d0.ray + 0x110) =
                               (uint)bVar8 * auVar91._16_4_ |
                               (uint)!bVar8 * *(int *)(local_7d0.ray + 0x110);
                          *(uint *)(local_7d0.ray + 0x114) =
                               (uint)bVar9 * auVar91._20_4_ |
                               (uint)!bVar9 * *(int *)(local_7d0.ray + 0x114);
                          *(uint *)(local_7d0.ray + 0x118) =
                               (uint)bVar10 * auVar91._24_4_ |
                               (uint)!bVar10 * *(int *)(local_7d0.ray + 0x118);
                          *(uint *)(local_7d0.ray + 0x11c) =
                               (uint)bVar11 * auVar91._28_4_ |
                               (uint)!bVar11 * *(int *)(local_7d0.ray + 0x11c);
                          bVar54 = auVar45 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar54 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar238;
                        }
                      }
                      bVar60 = false;
                      goto LAB_01b57831;
                    }
                  }
                  bVar60 = false;
                  bVar54 = 0;
                }
              }
LAB_01b57831:
              if (!bVar60) goto LAB_01b57bfa;
              lVar59 = lVar59 + -1;
            } while (lVar59 != 0);
            bVar54 = 0;
LAB_01b57bfa:
            bVar57 = bVar57 | bVar54 & 1;
            auVar47._4_4_ = fStack_57c;
            auVar47._0_4_ = local_580;
            auVar47._8_4_ = fStack_578;
            auVar47._12_4_ = fStack_574;
            auVar47._16_4_ = fStack_570;
            auVar47._20_4_ = fStack_56c;
            auVar47._24_4_ = fStack_568;
            auVar47._28_4_ = fStack_564;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar31._4_4_ = uVar1;
            auVar31._0_4_ = uVar1;
            auVar31._8_4_ = uVar1;
            auVar31._12_4_ = uVar1;
            auVar31._16_4_ = uVar1;
            auVar31._20_4_ = uVar1;
            auVar31._24_4_ = uVar1;
            auVar31._28_4_ = uVar1;
            uVar12 = vcmpps_avx512vl(auVar47,auVar31,2);
            bVar55 = bVar58 & bVar55 & (byte)uVar12;
          } while (bVar55 != 0);
        }
        uVar13 = vpcmpd_avx512vl(local_4a0,_local_5a0,1);
        uVar14 = vpcmpd_avx512vl(local_4a0,local_2e0,1);
        auVar180._0_4_ = (float)local_5c0._0_4_ + (float)local_1c0._0_4_;
        auVar180._4_4_ = (float)local_5c0._4_4_ + (float)local_1c0._4_4_;
        auVar180._8_4_ = fStack_5b8 + fStack_1b8;
        auVar180._12_4_ = fStack_5b4 + fStack_1b4;
        auVar180._16_4_ = fStack_5b0 + fStack_1b0;
        auVar180._20_4_ = fStack_5ac + fStack_1ac;
        auVar180._24_4_ = fStack_5a8 + fStack_1a8;
        auVar180._28_4_ = fStack_5a4 + fStack_1a4;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar200._4_4_ = uVar1;
        auVar200._0_4_ = uVar1;
        auVar200._8_4_ = uVar1;
        auVar200._12_4_ = uVar1;
        auVar200._16_4_ = uVar1;
        auVar200._20_4_ = uVar1;
        auVar200._24_4_ = uVar1;
        auVar200._28_4_ = uVar1;
        uVar12 = vcmpps_avx512vl(auVar180,auVar200,2);
        bVar51 = bVar51 & (byte)uVar14 & (byte)uVar12;
        auVar216._0_4_ = (float)local_5c0._0_4_ + (float)local_320._0_4_;
        auVar216._4_4_ = (float)local_5c0._4_4_ + (float)local_320._4_4_;
        auVar216._8_4_ = fStack_5b8 + fStack_318;
        auVar216._12_4_ = fStack_5b4 + fStack_314;
        auVar216._16_4_ = fStack_5b0 + fStack_310;
        auVar216._20_4_ = fStack_5ac + fStack_30c;
        auVar216._24_4_ = fStack_5a8 + fStack_308;
        auVar216._28_4_ = fStack_5a4 + fStack_304;
        uVar12 = vcmpps_avx512vl(auVar216,auVar200,2);
        bVar52 = bVar52 & (byte)uVar13 & (byte)uVar12 | bVar51;
        if (bVar52 != 0) {
          local_180[uVar50 * 0x60] = bVar52;
          bVar60 = (bool)(bVar51 >> 1 & 1);
          bVar5 = (bool)(bVar51 >> 2 & 1);
          bVar6 = (bool)(bVar51 >> 3 & 1);
          bVar7 = (bool)(bVar51 >> 4 & 1);
          bVar8 = (bool)(bVar51 >> 5 & 1);
          auStack_160[uVar50 * 0x18] =
               (uint)(bVar51 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar51 & 1) * local_320._0_4_;
          auStack_160[uVar50 * 0x18 + 1] =
               (uint)bVar60 * local_1c0._4_4_ | (uint)!bVar60 * local_320._4_4_;
          auStack_160[uVar50 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_1b8 | (uint)!bVar5 * (int)fStack_318;
          auStack_160[uVar50 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_1b4 | (uint)!bVar6 * (int)fStack_314;
          auStack_160[uVar50 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_1b0 | (uint)!bVar7 * (int)fStack_310;
          auStack_160[uVar50 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_1ac | (uint)!bVar8 * (int)fStack_30c;
          auStack_160[uVar50 * 0x18 + 6] =
               (uint)(bVar51 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar51 >> 6) * (int)fStack_308;
          (&fStack_144)[uVar50 * 0x18] = fStack_304;
          uVar12 = vmovlps_avx(local_6c0);
          (&local_140)[uVar50 * 0xc] = uVar12;
          local_138[uVar50 * 0x18] = (float)((int)fVar141 + 1);
          uVar50 = (ulong)((int)uVar50 + 1);
        }
      }
      auVar217 = ZEXT3264(_DAT_02020f20);
      auVar201 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    do {
      if ((int)uVar50 == 0) {
        if (bVar57 != 0) {
          return bVar61;
        }
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        uVar12 = vcmpps_avx512vl(local_510,auVar21,2);
        uVar56 = (uint)uVar62 & (uint)uVar12;
        uVar62 = (ulong)uVar56;
        bVar61 = uVar56 != 0;
        if (!bVar61) {
          return bVar61;
        }
        goto LAB_01b55407;
      }
      uVar63 = (ulong)((int)uVar50 - 1);
      auVar91 = *(undefined1 (*) [32])(auStack_160 + uVar63 * 0x18);
      auVar181._0_4_ = auVar91._0_4_ + (float)local_5c0._0_4_;
      auVar181._4_4_ = auVar91._4_4_ + (float)local_5c0._4_4_;
      auVar181._8_4_ = auVar91._8_4_ + fStack_5b8;
      auVar181._12_4_ = auVar91._12_4_ + fStack_5b4;
      auVar181._16_4_ = auVar91._16_4_ + fStack_5b0;
      auVar181._20_4_ = auVar91._20_4_ + fStack_5ac;
      auVar181._24_4_ = auVar91._24_4_ + fStack_5a8;
      auVar181._28_4_ = auVar91._28_4_ + fStack_5a4;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar1;
      auVar32._0_4_ = uVar1;
      auVar32._8_4_ = uVar1;
      auVar32._12_4_ = uVar1;
      auVar32._16_4_ = uVar1;
      auVar32._20_4_ = uVar1;
      auVar32._24_4_ = uVar1;
      auVar32._28_4_ = uVar1;
      uVar12 = vcmpps_avx512vl(auVar181,auVar32,2);
      uVar64 = (uint)uVar12 & (uint)local_180[uVar63 * 0x60];
      bVar52 = (byte)uVar64;
      if (uVar64 != 0) {
        auVar182._8_4_ = 0x7f800000;
        auVar182._0_8_ = 0x7f8000007f800000;
        auVar182._12_4_ = 0x7f800000;
        auVar182._16_4_ = 0x7f800000;
        auVar182._20_4_ = 0x7f800000;
        auVar182._24_4_ = 0x7f800000;
        auVar182._28_4_ = 0x7f800000;
        auVar89 = vblendmps_avx512vl(auVar182,auVar91);
        auVar133._0_4_ =
             (uint)(bVar52 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar52 & 1) * (int)auVar91._0_4_;
        bVar60 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar60 * auVar89._4_4_ | (uint)!bVar60 * (int)auVar91._4_4_;
        bVar60 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar60 * auVar89._8_4_ | (uint)!bVar60 * (int)auVar91._8_4_;
        bVar60 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar60 * auVar89._12_4_ | (uint)!bVar60 * (int)auVar91._12_4_;
        bVar60 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar60 * auVar89._16_4_ | (uint)!bVar60 * (int)auVar91._16_4_;
        bVar60 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar60 * auVar89._20_4_ | (uint)!bVar60 * (int)auVar91._20_4_;
        bVar60 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar60 * auVar89._24_4_ | (uint)!bVar60 * (int)auVar91._24_4_;
        auVar133._28_4_ =
             (uVar64 >> 7) * auVar89._28_4_ | (uint)!SUB41(uVar64 >> 7,0) * (int)auVar91._28_4_;
        auVar91 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar91 = vminps_avx(auVar133,auVar91);
        auVar89 = vshufpd_avx(auVar91,auVar91,5);
        auVar91 = vminps_avx(auVar91,auVar89);
        auVar89 = vpermpd_avx2(auVar91,0x4e);
        auVar91 = vminps_avx(auVar91,auVar89);
        uVar12 = vcmpps_avx512vl(auVar133,auVar91,0);
        bVar55 = (byte)uVar12 & bVar52;
        if (bVar55 != 0) {
          uVar64 = (uint)bVar55;
        }
        fVar229 = local_138[uVar63 * 0x18 + -1];
        uVar134 = 0;
        for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
          uVar134 = uVar134 + 1;
        }
        fVar141 = local_138[uVar63 * 0x18];
        bVar55 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar52;
        local_180[uVar63 * 0x60] = bVar55;
        auVar201 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        uVar53 = uVar63;
        if (bVar55 != 0) {
          uVar53 = uVar50;
        }
        fVar235 = *(float *)(&local_140 + uVar63 * 0xc);
        auVar183._4_4_ = fVar235;
        auVar183._0_4_ = fVar235;
        auVar183._8_4_ = fVar235;
        auVar183._12_4_ = fVar235;
        auVar183._16_4_ = fVar235;
        auVar183._20_4_ = fVar235;
        auVar183._24_4_ = fVar235;
        auVar183._28_4_ = fVar235;
        fVar229 = fVar229 - fVar235;
        auVar162._4_4_ = fVar229;
        auVar162._0_4_ = fVar229;
        auVar162._8_4_ = fVar229;
        auVar162._12_4_ = fVar229;
        auVar162._16_4_ = fVar229;
        auVar162._20_4_ = fVar229;
        auVar162._24_4_ = fVar229;
        auVar162._28_4_ = fVar229;
        auVar65 = vfmadd132ps_fma(auVar162,auVar183,auVar217._0_32_);
        auVar91 = ZEXT1632(auVar65);
        local_440[0] = (RTCHitN)auVar91[0];
        local_440[1] = (RTCHitN)auVar91[1];
        local_440[2] = (RTCHitN)auVar91[2];
        local_440[3] = (RTCHitN)auVar91[3];
        local_440[4] = (RTCHitN)auVar91[4];
        local_440[5] = (RTCHitN)auVar91[5];
        local_440[6] = (RTCHitN)auVar91[6];
        local_440[7] = (RTCHitN)auVar91[7];
        local_440[8] = (RTCHitN)auVar91[8];
        local_440[9] = (RTCHitN)auVar91[9];
        local_440[10] = (RTCHitN)auVar91[10];
        local_440[0xb] = (RTCHitN)auVar91[0xb];
        local_440[0xc] = (RTCHitN)auVar91[0xc];
        local_440[0xd] = (RTCHitN)auVar91[0xd];
        local_440[0xe] = (RTCHitN)auVar91[0xe];
        local_440[0xf] = (RTCHitN)auVar91[0xf];
        local_440[0x10] = (RTCHitN)auVar91[0x10];
        local_440[0x11] = (RTCHitN)auVar91[0x11];
        local_440[0x12] = (RTCHitN)auVar91[0x12];
        local_440[0x13] = (RTCHitN)auVar91[0x13];
        local_440[0x14] = (RTCHitN)auVar91[0x14];
        local_440[0x15] = (RTCHitN)auVar91[0x15];
        local_440[0x16] = (RTCHitN)auVar91[0x16];
        local_440[0x17] = (RTCHitN)auVar91[0x17];
        local_440[0x18] = (RTCHitN)auVar91[0x18];
        local_440[0x19] = (RTCHitN)auVar91[0x19];
        local_440[0x1a] = (RTCHitN)auVar91[0x1a];
        local_440[0x1b] = (RTCHitN)auVar91[0x1b];
        local_440[0x1c] = (RTCHitN)auVar91[0x1c];
        local_440[0x1d] = (RTCHitN)auVar91[0x1d];
        local_440[0x1e] = (RTCHitN)auVar91[0x1e];
        local_440[0x1f] = (RTCHitN)auVar91[0x1f];
        local_6c0._8_8_ = 0;
        local_6c0._0_8_ = *(ulong *)(local_440 + (ulong)uVar134 * 4);
        uVar63 = uVar53;
      }
      uVar50 = uVar63;
    } while (bVar52 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }